

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O2

int jpc_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  uint_fast16_t *puVar1;
  jpc_ms_t **ppjVar2;
  double *pdVar3;
  jpc_flt_t *pjVar4;
  ulong *puVar5;
  uint_fast16_t *puVar6;
  _Bool _Var7;
  jas_image_cmpt_t *pjVar8;
  jas_image_cmpt_t *pjVar9;
  size_t num_elements;
  jas_image_t *image_00;
  jpc_enc_tcmpt_s *pjVar10;
  jpc_enc_rlvl_s *pjVar11;
  jpc_enc_prc_t *pjVar12;
  jpc_enc_rlvl_s *pjVar13;
  jpc_enc_band_s *pjVar14;
  jpc_enc_pass_t *pjVar15;
  uint_fast8_t uVar16;
  uint cmptno;
  int iVar17;
  uint uVar18;
  int iVar19;
  jpc_enc_cp_t *pjVar20;
  ulong uVar21;
  jpc_enc_ccp_t *pjVar22;
  uint_fast32_t uVar23;
  jas_tvparser_t *tvp;
  jas_taginfo_t *pjVar24;
  ulong uVar25;
  jpc_fix_t *pjVar26;
  jpc_enc_t *enc;
  jpc_cstate_t *pjVar27;
  jpc_ms_t *pjVar28;
  jpc_sizcomp_t *pjVar29;
  uint_fast8_t *puVar30;
  size_t sVar31;
  uchar *puVar32;
  jpc_tsfb_t *pjVar33;
  jpc_enc_tile_t *pjVar34;
  uint_fast32_t *puVar35;
  ulong uVar36;
  jas_matrix_t *pjVar37;
  jpc_enc_prc_t *pjVar38;
  jpc_tagtree_t *pjVar39;
  uint_fast16_t uVar40;
  jpc_pi_t *pjVar41;
  jpc_enc_band_t *pjVar42;
  jas_seqent_t jVar43;
  jas_stream_t *pjVar44;
  jpc_enc_tcmpt_t *pjVar45;
  byte bVar46;
  byte bVar47;
  uint_fast32_t *puVar48;
  uint_fast32_t uVar49;
  jpc_enc_tile_t **ppjVar50;
  jpc_tsfb_t **ppjVar51;
  long lVar52;
  long lVar53;
  jpc_enc_pass_t *pjVar54;
  uint_fast32_t uVar55;
  ulong uVar56;
  uint_fast16_t uVar57;
  jpc_fix_t jVar58;
  long lVar59;
  jpc_enc_pass_t *pjVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  uint *puVar65;
  jpc_enc_cblk_t *pjVar66;
  int iVar67;
  long lVar68;
  jpc_enc_rlvl_t *pjVar69;
  jpc_enc_cblk_t *pjVar70;
  int iVar71;
  uint_fast32_t uVar72;
  undefined1 (*pauVar73) [16];
  jpc_fix_t jVar74;
  long lVar75;
  long *plVar76;
  jpc_enc_band_t *pjVar77;
  char *pcVar78;
  char *pcVar79;
  uint_fast32_t uVar80;
  long *plVar81;
  jas_matind_t i;
  jas_matind_t j;
  uint_fast32_t *puVar82;
  ulong uVar83;
  uint uVar84;
  long lVar85;
  ulong uVar86;
  uint *puVar87;
  jas_matrix_t **ppjVar88;
  long lVar89;
  uint i_1;
  long lVar90;
  jpc_enc_rlvl_t *pjVar91;
  jpc_enc_pass_t *pjVar92;
  bool bVar93;
  double dVar94;
  jpc_enc_tcmpt_t *pjVar95;
  jpc_enc_tcmpt_t *pjVar96;
  double dVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  double dVar104;
  jas_matrix_t *in_stack_ffffffffffffe838;
  jpc_enc_tcmpt_t *local_17b8;
  jpc_enc_tcmpt_t *local_17b0;
  jpc_enc_tcmpt_t *tcmpt;
  jpc_enc_tcmpt_t *local_17a0;
  uint_fast16_t cmptno_1;
  jpc_enc_tcmpt_t *local_1788;
  jpc_enc_rlvl_t *local_1780;
  char *local_1778;
  jpc_enc_tcmpt_t *local_1768;
  jpc_enc_tcmpt_t *local_1760;
  jpc_enc_cp_t *local_1758;
  ulong local_1750;
  ulong local_1748;
  ulong local_1738;
  ulong local_1730;
  jpc_enc_tcmpt_t *local_1720;
  ulong local_1718;
  int numilyrrates;
  jpc_tsfb_band_t bandinfos [100];
  
  jpc_initluts();
  bandinfos[0].xstart = 0;
  bandinfos[0].ystart = 0;
  numilyrrates = 0;
  pjVar20 = (jpc_enc_cp_t *)jas_malloc(0x2d0);
  if (pjVar20 != (jpc_enc_cp_t *)0x0) {
    pjVar20->ccps = (jpc_enc_ccp_t *)0x0;
    pjVar20->debug = 0;
    puVar35 = &pjVar20->imgareatlx;
    *(undefined4 *)&pjVar20->imgareatlx = 0xffffffff;
    *(undefined4 *)((long)&pjVar20->imgareatlx + 4) = 0xffffffff;
    *(undefined4 *)&pjVar20->imgareatly = 0xffffffff;
    *(undefined4 *)((long)&pjVar20->imgareatly + 4) = 0xffffffff;
    pjVar20->refgrdwidth = 0;
    pjVar20->refgrdheight = 0;
    puVar82 = &pjVar20->tilewidth;
    *(undefined4 *)&pjVar20->tilegrdoffx = 0xffffffff;
    *(undefined4 *)((long)&pjVar20->tilegrdoffx + 4) = 0xffffffff;
    *(undefined4 *)&pjVar20->tilegrdoffy = 0xffffffff;
    *(undefined4 *)((long)&pjVar20->tilegrdoffy + 4) = 0xffffffff;
    pjVar20->tilewidth = 0;
    pjVar20->tileheight = 0;
    uVar25 = (ulong)image->numcmpts_;
    pjVar20->numcmpts = uVar25;
    lVar85 = 1;
    lVar89 = lVar85;
    for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
      pjVar8 = image->cmpts_[uVar21];
      lVar52 = pjVar8->hstep_;
      if ((pjVar8->tlx_ + lVar52 + pjVar8->width_ * lVar52 <= image->brx_) ||
         (lVar53 = pjVar8->vstep_, pjVar8->tly_ + lVar53 + pjVar8->height_ * lVar53 <= image->bry_))
      {
        pcVar78 = "unsupported image type\n";
        goto LAB_0011e30a;
      }
      lVar85 = lVar85 * lVar52;
      lVar89 = lVar89 * lVar53;
    }
    pjVar22 = (jpc_enc_ccp_t *)jas_alloc2(uVar25,0x330);
    pjVar20->ccps = pjVar22;
    if (pjVar22 != (jpc_enc_ccp_t *)0x0) {
      for (uVar21 = 0; uVar21 < pjVar20->numcmpts; uVar21 = (ulong)((int)uVar21 + 1)) {
        pjVar8 = image->cmpts_[uVar21];
        pjVar22->sampgrdstepx = (uint_fast8_t)pjVar8->hstep_;
        pjVar22->sampgrdstepy = (uint_fast8_t)pjVar8->vstep_;
        pjVar22->sampgrdsubstepx = '\0';
        pjVar22->prec = (uint_fast8_t)pjVar8->prec_;
        pjVar22->sgnd = pjVar8->sgnd_ != 0;
        puVar1 = &pjVar22->numstepsizes;
        pjVar22 = pjVar22 + 1;
        memset(puVar1,0,0x328);
      }
      uVar23 = jas_image_rawsize(image);
      pjVar20->rawsize = uVar23;
      if (uVar23 != 0) {
        pjVar20->totalsize = 0xffffffffffffffff;
        (pjVar20->tcp).intmode = true;
        (pjVar20->tcp).csty = '\0';
        (pjVar20->tcp).prg = '\0';
        (pjVar20->tcp).numlyrs = 1;
        (pjVar20->tcp).ilyrrates = (jpc_fix_t *)0x0;
        (pjVar20->tccp).csty = '\0';
        (pjVar20->tccp).maxrlvls = '\x06';
        (pjVar20->tccp).cblkwidthexpn = 6;
        (pjVar20->tccp).cblkheightexpn = 6;
        (pjVar20->tccp).cblksty = '\0';
        (pjVar20->tccp).numgbits = '\x02';
        pcVar78 = "";
        if (optstr != (char *)0x0) {
          pcVar78 = optstr;
        }
        tvp = jas_tvparser_create(pcVar78);
        if (tvp != (jas_tvparser_t *)0x0) {
          local_1730 = 0xf;
          tcmpt = (jpc_enc_tcmpt_t *)0xf;
          cmptno_1 = 0;
          bVar47 = 1;
switchD_0011e4d6_caseD_d:
          bVar46 = bVar47;
          iVar17 = jas_tvparser_next(tvp);
          if (iVar17 != 0) goto LAB_0011e884;
          pcVar78 = jas_tvparser_gettag(tvp);
          pjVar24 = jas_taginfos_lookup(encopts,pcVar78);
          pjVar24 = jas_taginfo_nonull(pjVar24);
          bVar47 = 0;
          switch(pjVar24->id) {
          case 0:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            pjVar20->debug = iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 1:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            uVar23 = (uint_fast32_t)iVar17;
            puVar48 = puVar35;
            break;
          case 2:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            pjVar20->imgareatly = (long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 3:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            uVar23 = (uint_fast32_t)iVar17;
            puVar48 = &pjVar20->tilegrdoffx;
            break;
          case 4:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            pjVar20->tilegrdoffy = (long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 5:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            uVar23 = (uint_fast32_t)iVar17;
            puVar48 = puVar82;
            break;
          case 6:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            pjVar20->tileheight = (long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 7:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            iVar17 = jpc_floorlog2(iVar17);
            local_1730 = (ulong)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 8:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            iVar17 = jpc_floorlog2(iVar17);
            tcmpt = (jpc_enc_tcmpt_t *)(long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 9:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            iVar17 = jpc_floorlog2(iVar17);
            (pjVar20->tccp).cblkwidthexpn = (long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 10:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            iVar17 = jpc_floorlog2(iVar17);
            (pjVar20->tccp).cblkheightexpn = (long)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0xb:
            pcVar78 = jas_tvparser_getval(tvp);
            pjVar24 = jas_taginfos_lookup(modetab,pcVar78);
            pjVar24 = jas_taginfo_nonull(pjVar24);
            if (pjVar24->id < 0) {
              pcVar79 = "ignoring invalid mode %s\n";
              goto LAB_0011e873;
            }
            (pjVar20->tcp).intmode = pjVar24->id == 0;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0xc:
            pcVar78 = jas_tvparser_getval(tvp);
            pjVar24 = jas_taginfos_lookup(prgordtab,pcVar78);
            pjVar24 = jas_taginfo_nonull(pjVar24);
            if (pjVar24->id < 0) {
              pcVar79 = "ignoring invalid progression order %s\n";
              goto LAB_0011e873;
            }
            (pjVar20->tcp).prg = (uint_fast8_t)pjVar24->id;
            bVar47 = bVar46;
          case 0xd:
            goto switchD_0011e4d6_caseD_d;
          case 0xe:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            (pjVar20->tccp).maxrlvls = (uint_fast8_t)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0xf:
            puVar30 = &(pjVar20->tcp).csty;
            *puVar30 = *puVar30 | 2;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x10:
            puVar30 = &(pjVar20->tcp).csty;
            *puVar30 = *puVar30 | 4;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x11:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 1;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x12:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 4;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x13:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 0x20;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x14:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 8;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x15:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 2;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x16:
            puVar30 = &(pjVar20->tccp).cblksty;
            *puVar30 = *puVar30 | 0x10;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x17:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            (pjVar20->tccp).numgbits = (uint_fast8_t)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x18:
            pcVar78 = jas_tvparser_getval(tvp);
            uVar23 = pjVar20->rawsize;
            pcVar79 = strchr(pcVar78,0x42);
            if (pcVar79 == (char *)0x0) {
              dVar94 = atof(pcVar78);
              if (0.0 <= dVar94) {
                if (dVar94 <= 1.0) {
                  auVar98._0_8_ = (double)CONCAT44(0x43300000,(int)uVar23);
                  auVar98._8_4_ = (int)(uVar23 >> 0x20);
                  auVar98._12_4_ = 0x45300000;
                  dVar94 = dVar94 * ((auVar98._8_8_ - 1.9342813113834067e+25) +
                                    (auVar98._0_8_ - 4503599627370496.0));
                  uVar21 = (ulong)dVar94;
                  uVar23 = (long)(dVar94 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21;
                }
                else {
                  uVar23 = uVar23 + 1;
                }
              }
              else {
                uVar23 = 0;
              }
            }
            else {
              iVar17 = atoi(pcVar78);
              uVar23 = (uint_fast32_t)iVar17;
            }
            pjVar20->totalsize = uVar23;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          case 0x19:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = jpc_atoaf(pcVar78,&numilyrrates,(double **)bandinfos);
            bVar47 = bVar46;
            if (iVar17 != 0) {
              pcVar78 = jas_tvparser_getval(tvp);
              jas_eprintf("warning: invalid intermediate layer rates specifier ignored (%s)\n",
                          pcVar78);
            }
            goto switchD_0011e4d6_caseD_d;
          case 0x1a:
            pcVar78 = jas_tvparser_getval(tvp);
            iVar17 = atoi(pcVar78);
            cmptno_1 = (uint_fast16_t)iVar17;
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          default:
            pcVar79 = "warning: ignoring invalid option %s\n";
LAB_0011e873:
            jas_eprintf(pcVar79,pcVar78);
            bVar47 = bVar46;
            goto switchD_0011e4d6_caseD_d;
          }
          *puVar48 = uVar23;
          bVar47 = bVar46;
          goto switchD_0011e4d6_caseD_d;
        }
      }
    }
    goto LAB_0011e311;
  }
  goto LAB_0011e32b;
  while (plVar76 = (pjVar20->tcp).ilyrrates + lVar85, lVar85 = lVar85 + 1,
        (double)*plVar76 * 0.0001220703125 <=
        ((auVar99._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) /
        (((double)CONCAT44(0x45300000,(int)(pjVar20->rawsize >> 0x20)) - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pjVar20->rawsize) - 4503599627370496.0))) {
LAB_0011ed35:
    if (uVar25 - 1 == lVar85) goto LAB_0011ed84;
  }
  pcVar78 = "warning: intermediate layer rates must be less than overall rate\n";
  goto LAB_0011ec7c;
LAB_0011e884:
  jas_tvparser_destroy(tvp);
  uVar21 = pjVar20->totalsize;
  if (uVar21 != 0xffffffffffffffff) {
    uVar23 = 0;
    if (cmptno_1 <= uVar21) {
      uVar23 = uVar21 - cmptno_1;
    }
    pjVar20->totalsize = uVar23;
  }
  uVar23 = *puVar35;
  if (uVar23 == 0xffffffffffffffff) {
    uVar23 = 0;
  }
  else {
    if (lVar85 != 1) {
      jas_eprintf("warning: overriding imgareatlx value\n");
      uVar23 = *puVar35;
    }
    uVar23 = uVar23 * lVar85;
  }
  pjVar20->imgareatlx = uVar23;
  uVar49 = pjVar20->imgareatly;
  if (uVar49 == 0xffffffffffffffff) {
    uVar49 = 0;
  }
  else {
    if (lVar89 != 1) {
      jas_eprintf("warning: overriding imgareatly value\n");
      uVar23 = pjVar20->imgareatlx;
      uVar49 = pjVar20->imgareatly;
    }
    uVar49 = uVar49 * lVar89;
  }
  pjVar20->imgareatly = uVar49;
  uVar72 = (image->brx_ - image->tlx_) + uVar23;
  pjVar20->refgrdwidth = uVar72;
  uVar55 = (image->bry_ - image->tly_) + uVar49;
  pjVar20->refgrdheight = uVar55;
  uVar80 = pjVar20->tilegrdoffx;
  if (pjVar20->tilegrdoffx == 0xffffffffffffffff) {
    pjVar20->tilegrdoffx = uVar23;
    uVar80 = uVar23;
  }
  uVar23 = pjVar20->tilegrdoffy;
  if (pjVar20->tilegrdoffy == 0xffffffffffffffff) {
    pjVar20->tilegrdoffy = uVar49;
    uVar23 = uVar49;
  }
  if (*puVar82 == 0) {
    *puVar82 = uVar72 - uVar80;
  }
  if (pjVar20->tileheight == 0) {
    pjVar20->tileheight = uVar55 - uVar23;
  }
  if (pjVar20->numcmpts == 3) {
    bVar47 = 1;
    for (uVar21 = 0; image->numcmpts_ != uVar21; uVar21 = uVar21 + 1) {
      pjVar8 = image->cmpts_[uVar21];
      pjVar9 = *image->cmpts_;
      if ((((pjVar8->prec_ != pjVar9->prec_) || (pjVar8->sgnd_ != pjVar9->sgnd_)) ||
          (pjVar8->width_ != pjVar9->width_)) || (pjVar8->height_ != pjVar9->height_)) {
        bVar47 = 0;
      }
    }
    if (!(bool)(bVar47 & bVar46)) goto LAB_0011ea35;
    uVar84 = image->clrspc_;
    if ((uVar84 & 0xffffff00) != 0x400) {
      jas_eprintf("warning: color space apparently not RGB\n");
      uVar84 = image->clrspc_;
    }
    if ((uVar84 & 0xffffff00) != 0x400) goto LAB_0011ea35;
    uVar16 = (pjVar20->tcp).intmode;
    (pjVar20->tcp).mctid = uVar16 + '\x01';
  }
  else {
LAB_0011ea35:
    (pjVar20->tcp).mctid = '\0';
    uVar16 = (pjVar20->tcp).intmode;
  }
  (pjVar20->tccp).qmfbid = uVar16;
  bVar47 = (pjVar20->tccp).maxrlvls;
  for (uVar21 = 0; bVar47 != uVar21; uVar21 = uVar21 + 1) {
    (pjVar20->tccp).prcwidthexpns[uVar21] = local_1730;
    (pjVar20->tccp).prcheightexpns[uVar21] = (uint_fast16_t)tcmpt;
  }
  if ((local_1730 != 0xf) || (tcmpt != (jpc_enc_tcmpt_t *)0xf)) {
    (pjVar20->tccp).csty = (pjVar20->tccp).csty | 1;
  }
  uVar21 = *puVar82;
  if (uVar21 == 0) {
    pcVar78 = "invalid tile width %lu\n";
LAB_0011eac5:
    jas_eprintf(pcVar78,0);
  }
  else {
    uVar25 = pjVar20->tileheight;
    if (uVar25 == 0) {
      pcVar78 = "invalid tile height %lu\n";
      goto LAB_0011eac5;
    }
    uVar56 = pjVar20->tilegrdoffx;
    uVar36 = pjVar20->tilegrdoffy;
    if (((pjVar20->imgareatlx < uVar56) || (uVar36 + uVar25 < pjVar20->imgareatly)) ||
       ((uVar56 + uVar21 < pjVar20->imgareatlx || (pjVar20->imgareatly < uVar36)))) {
      jas_eprintf("invalid tile grid offset (%lu, %lu)\n",uVar56,uVar36);
    }
    else {
      uVar21 = (~uVar56 + uVar21 + pjVar20->refgrdwidth) / uVar21;
      pjVar20->numhtiles = uVar21;
      uVar25 = (~uVar36 + uVar25 + pjVar20->refgrdheight) / uVar25;
      pjVar20->numvtiles = uVar25;
      pjVar20->numtiles = uVar25 * uVar21;
      if (0 < numilyrrates && bandinfos[0]._0_8_ != 0) {
        (pjVar20->tcp).numlyrs = (ulong)(uint)numilyrrates + 1;
        pjVar26 = (jpc_fix_t *)jas_alloc2((ulong)(uint)numilyrrates,8);
        (pjVar20->tcp).ilyrrates = pjVar26;
        if (pjVar26 == (jpc_fix_t *)0x0) goto LAB_0011e311;
        for (lVar85 = 0; lVar85 < (int)(pjVar20->tcp).numlyrs + -1; lVar85 = lVar85 + 1) {
          pjVar26[lVar85] = (long)(*(double *)(bandinfos[0]._0_8_ + lVar85 * 8) * 8192.0);
        }
      }
      uVar21 = pjVar20->totalsize;
      if ((uVar21 == 0xffffffffffffffff) && ((pjVar20->tcp).intmode == false)) {
        pcVar78 = "cannot use real mode for lossless coding\n";
      }
      else if (local_1730 < 0x10) {
        if (tcmpt < (jpc_enc_tcmpt_t *)0x10) {
          uVar40 = (pjVar20->tccp).cblkwidthexpn;
          if (uVar40 - 0xd < 0xfffffffffffffff5) {
            bVar47 = (byte)uVar40;
            pcVar78 = "invalid code block width %d\n";
          }
          else {
            uVar57 = (pjVar20->tccp).cblkheightexpn;
            if (0xfffffffffffffff4 < uVar57 - 0xd) {
              if (uVar57 + uVar40 < 0xd) {
                uVar25 = (pjVar20->tcp).numlyrs;
                if (uVar25 < 0x4001) {
                  if ((pjVar20->tccp).maxrlvls == '\0') {
                    pcVar78 = "must be at least one resolution level\n";
                  }
                  else if ((pjVar20->tccp).numgbits < 9) {
                    if ((uVar21 != 0xffffffffffffffff) && (pjVar20->rawsize < uVar21)) {
                      jas_eprintf("warning: specified rate is unreasonably large (%lu > %lu)\n");
                      uVar25 = (pjVar20->tcp).numlyrs;
                    }
                    if (uVar25 < 2) {
LAB_0011ed84:
                      if (bandinfos[0]._0_8_ != 0) {
                        jas_free((void *)bandinfos[0]._0_8_);
                      }
                      enc = (jpc_enc_t *)jas_malloc(0x48);
                      if (enc != (jpc_enc_t *)0x0) {
                        enc->image = image;
                        enc->out = out;
                        enc->cp = pjVar20;
                        enc->curtile = (jpc_enc_tile_t *)0x0;
                        enc->cstate = (jpc_cstate_t *)0x0;
                        enc->mrk = (jpc_ms_t *)0x0;
                        enc->tmpstream = (jas_stream_t *)0x0;
                        pjVar27 = jpc_cstate_create();
                        enc->cstate = pjVar27;
                        if (pjVar27 != (jpc_cstate_t *)0x0) {
                          enc->len = 0;
                          enc->mainbodysize = 0;
                          pjVar20 = enc->cp;
                          lVar85 = enc->out->rwcnt_;
                          pjVar28 = jpc_ms_create(0xff4f);
                          enc->mrk = pjVar28;
                          if (pjVar28 == (jpc_ms_t *)0x0) {
                            pcVar78 = "cannot create SOC marker\n";
LAB_0011ee4a:
                            jas_eprintf(pcVar78);
LAB_0011ee54:
                            local_1778 = "cannot encode main header\n";
                          }
                          else {
                            iVar17 = jpc_putms(enc->out,enc->cstate,pjVar28);
                            if (iVar17 != 0) {
                              pcVar78 = "cannot write SOC marker\n";
                              goto LAB_0011ee4a;
                            }
                            ppjVar2 = &enc->mrk;
                            jpc_ms_destroy(*ppjVar2);
                            *ppjVar2 = (jpc_ms_t *)0x0;
                            pjVar28 = jpc_ms_create(0xff51);
                            *ppjVar2 = pjVar28;
                            if (pjVar28 == (jpc_ms_t *)0x0) {
                              pcVar78 = "cannot create SIZ marker\n";
                              goto LAB_0011ee4a;
                            }
                            (pjVar28->parms).sot.tileno = 0;
                            uVar23 = pjVar20->imgareatly;
                            (pjVar28->parms).siz.xoff = pjVar20->imgareatlx;
                            (pjVar28->parms).siz.yoff = uVar23;
                            uVar23 = pjVar20->refgrdheight;
                            (pjVar28->parms).sot.len = pjVar20->refgrdwidth;
                            (pjVar28->parms).siz.height = uVar23;
                            uVar23 = pjVar20->tilegrdoffy;
                            (pjVar28->parms).siz.tilexoff = pjVar20->tilegrdoffx;
                            (pjVar28->parms).siz.tileyoff = uVar23;
                            uVar23 = pjVar20->tileheight;
                            (pjVar28->parms).siz.tilewidth = pjVar20->tilewidth;
                            (pjVar28->parms).siz.tileheight = uVar23;
                            num_elements = pjVar20->numcmpts;
                            (pjVar28->parms).siz.numcomps = num_elements;
                            pjVar29 = (jpc_sizcomp_t *)jas_alloc2(num_elements,4);
                            (pjVar28->parms).siz.comps = pjVar29;
                            if (pjVar29 == (jpc_sizcomp_t *)0x0) {
                              __assert_fail("siz->comps",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                            ,0x3a5,"int jpc_enc_encodemainhdr(jpc_enc_t *)");
                            }
                            ppjVar50 = &enc->curtile;
                            uVar84 = (uint)pjVar20->numcmpts;
                            uVar25 = 0;
                            uVar21 = (ulong)uVar84;
                            if ((int)uVar84 < 1) {
                              uVar21 = uVar25;
                            }
                            puVar30 = &pjVar29->vsamp;
                            for (; uVar21 * 0x330 - uVar25 != 0; uVar25 = uVar25 + 0x330) {
                              pjVar22 = pjVar20->ccps;
                              ((jpc_sizcomp_t *)(puVar30 + -3))->prec =
                                   *(uint_fast8_t *)((long)pjVar22->stepsizes + (uVar25 - 0xc));
                              puVar30[-2] = *(uint_fast8_t *)
                                             ((long)pjVar22->stepsizes + (uVar25 - 0xb));
                              puVar30[-1] = *(uint_fast8_t *)
                                             ((long)pjVar22->stepsizes + (uVar25 - 0x10));
                              *puVar30 = *(uint_fast8_t *)
                                          ((long)pjVar22->stepsizes + (uVar25 - 0xf));
                              puVar30 = puVar30 + 4;
                            }
                            iVar17 = jpc_putms(enc->out,enc->cstate,enc->mrk);
                            if (iVar17 != 0) {
                              pcVar78 = "cannot write SIZ marker\n";
                              goto LAB_0011ee4a;
                            }
                            jpc_ms_destroy(*ppjVar2);
                            *ppjVar2 = (jpc_ms_t *)0x0;
                            pjVar28 = jpc_ms_create(0xff64);
                            *ppjVar2 = pjVar28;
                            if (pjVar28 == (jpc_ms_t *)0x0) {
                              pcVar78 = "cannot create COM marker\n";
                              goto LAB_0011ee4a;
                            }
                            pcVar78 = jas_getversion();
                            sprintf((char *)&numilyrrates,"Creator: JasPer Version %s",pcVar78);
                            pjVar28 = *ppjVar2;
                            sVar31 = strlen((char *)&numilyrrates);
                            (pjVar28->parms).sot.len = sVar31;
                            (pjVar28->parms).sot.tileno = 1;
                            puVar32 = (uchar *)jas_strdup((char *)&numilyrrates);
                            (pjVar28->parms).ppm.data = puVar32;
                            if (puVar32 == (uchar *)0x0) {
LAB_0012179a:
                              abort();
                            }
                            iVar17 = jpc_putms(enc->out,enc->cstate,enc->mrk);
                            if (iVar17 != 0) {
                              pcVar78 = "cannot write COM marker\n";
                              goto LAB_0011ee4a;
                            }
                            jpc_ms_destroy(*ppjVar2);
                            *ppjVar2 = (jpc_ms_t *)0x0;
                            local_17b8 = (jpc_enc_tcmpt_t *)0x10;
                            for (tcmpt = (jpc_enc_tcmpt_t *)0x0;
                                tcmpt < (jpc_enc_tcmpt_t *)pjVar20->numcmpts;
                                tcmpt = (jpc_enc_tcmpt_t *)((long)&tcmpt->numrlvls + 1)) {
                              pjVar33 = jpc_cod_gettsfb((uint)(pjVar20->tccp).qmfbid,
                                                        (pjVar20->tccp).maxrlvls - 1);
                              uVar23 = (uint_fast32_t)(1 << ((pjVar20->tccp).maxrlvls & 0x1f));
                              jpc_tsfb_getbands(pjVar33,0,0,uVar23,uVar23,bandinfos);
                              jpc_tsfb_destroy(pjVar33);
                              bVar47 = (pjVar20->tccp).maxrlvls;
                              pjVar26 = &bandinfos[0].synenergywt;
                              uVar21 = 0xffffffffffffffff;
                              while ((ulong)bVar47 * -3 + 2 + uVar21 != -1) {
                                iVar17 = 0;
                                if (uVar21 + 1 != 0) {
                                  iVar17 = (int)(uVar21 / 3) + 1;
                                }
                                iVar17 = JPC_NOMINALGAIN((uint)(pjVar20->tccp).qmfbid,(uint)bVar47,
                                                         iVar17,*(int *)(pjVar26 + -3));
                                lVar89 = 0x2000;
                                if ((pjVar20->tcp).intmode == false) {
                                  lVar89 = ((long)(0x2000 << ((char)iVar17 + 1U & 0x1f)) << 0xd) /
                                           *pjVar26;
                                }
                                pjVar22 = pjVar20->ccps;
                                uVar23 = jpc_abstorelstepsize
                                                   (lVar89,iVar17 + (uint)pjVar22[(long)tcmpt].prec)
                                ;
                                if (uVar23 == 0xffffffffffffffff) goto LAB_0011ee54;
                                *(uint_fast32_t *)
                                 ((long)pjVar22->stepsizes + uVar21 * 8 + (long)local_17b8 + -8) =
                                     uVar23;
                                pjVar26 = pjVar26 + 6;
                                uVar21 = uVar21 + 1;
                              }
                              pjVar20->ccps[(long)tcmpt].numstepsizes = (ulong)bVar47 * 3 - 2;
                              local_17b8 = (jpc_enc_tcmpt_t *)((long)local_17b8 + 0x330);
                            }
                            pjVar28 = jpc_ms_create(0xff52);
                            *ppjVar2 = pjVar28;
                            if (pjVar28 == (jpc_ms_t *)0x0) {
                              pcVar78 = "cannot create COD marker\n";
                              goto LAB_0011ee4a;
                            }
                            bVar47 = (pjVar20->tccp).csty;
                            bVar46 = (pjVar20->tcp).csty | bVar47;
                            (pjVar28->parms).cod.csty = bVar46;
                            (pjVar28->parms).cod.compparms.csty = bVar46;
                            bVar46 = (pjVar20->tccp).maxrlvls;
                            (pjVar28->parms).cod.compparms.numdlvls = bVar46 - 1;
                            *(uint *)((long)&pjVar28->parms + 0x1c) = (uint)bVar46;
                            (pjVar28->parms).cod.prg = (pjVar20->tcp).prg;
                            (pjVar28->parms).sot.len = (pjVar20->tcp).numlyrs;
                            (pjVar28->parms).cod.compparms.cblkwidthval =
                                 (char)(pjVar20->tccp).cblkwidthexpn + 0xfe;
                            (pjVar28->parms).cod.compparms.cblkheightval =
                                 (char)(pjVar20->tccp).cblkheightexpn + 0xfe;
                            (pjVar28->parms).cod.compparms.cblksty = (pjVar20->tccp).cblksty;
                            (pjVar28->parms).cod.compparms.qmfbid = (pjVar20->tccp).qmfbid;
                            (pjVar28->parms).sot.partno = (pjVar20->tcp).mctid != '\0';
                            if ((bVar47 & 1) != 0) {
                              for (uVar21 = 0; bVar46 != uVar21; uVar21 = uVar21 + 1) {
                                *(char *)((long)&pjVar28->parms + uVar21 * 2 + 0x20) =
                                     (char)(pjVar20->tccp).prcwidthexpns[uVar21];
                                *(char *)((long)&pjVar28->parms + uVar21 * 2 + 0x21) =
                                     (char)(pjVar20->tccp).prcheightexpns[uVar21];
                              }
                            }
                            iVar17 = jpc_putms(enc->out,enc->cstate,pjVar28);
                            if (iVar17 != 0) {
                              pcVar78 = "cannot write COD marker\n";
                              goto LAB_0011ee4a;
                            }
                            jpc_ms_destroy(*ppjVar2);
                            *ppjVar2 = (jpc_ms_t *)0x0;
                            pjVar28 = jpc_ms_create(0xff5c);
                            *ppjVar2 = pjVar28;
                            if (pjVar28 == (jpc_ms_t *)0x0) {
                              pcVar78 = "cannot create QCD marker\n";
                              goto LAB_0011ee4a;
                            }
                            (pjVar28->parms).cod.csty = ((pjVar20->tccp).qmfbid == '\0') * '\x02';
                            pjVar22 = pjVar20->ccps;
                            *(int *)((long)&pjVar28->parms + 4) = (int)pjVar22->numstepsizes;
                            (pjVar28->parms).sot.partno = (pjVar20->tccp).numgbits;
                            (pjVar28->parms).poc.pchgs = (jpc_pocpchg_t *)pjVar22->stepsizes;
                            iVar17 = jpc_putms(enc->out,enc->cstate,pjVar28);
                            pcVar78 = "cannot write marker\n";
                            if (iVar17 != 0) goto LAB_0011ee4a;
                            (pjVar28->parms).sot.len = 0;
                            jpc_ms_destroy(*ppjVar2);
                            *ppjVar2 = (jpc_ms_t *)0x0;
                            lVar89 = 0x340;
                            for (uVar21 = 1; uVar21 < pjVar20->numcmpts; uVar21 = uVar21 + 1) {
                              pjVar28 = jpc_ms_create(0xff5d);
                              *ppjVar2 = pjVar28;
                              if (pjVar28 == (jpc_ms_t *)0x0) {
                                pcVar78 = "cannot create QCC marker\n";
                                goto LAB_0011ee4a;
                              }
                              (pjVar28->parms).sot.tileno = uVar21;
                              (pjVar28->parms).coc.compparms.csty =
                                   ((pjVar20->tccp).qmfbid == '\0') * '\x02';
                              pjVar22 = pjVar20->ccps;
                              *(undefined4 *)((long)&pjVar28->parms + 0xc) =
                                   *(undefined4 *)((long)pjVar22->stepsizes + lVar89 + -0x18);
                              (pjVar28->parms).cod.compparms.cblksty = (pjVar20->tccp).numgbits;
                              (pjVar28->parms).ppm.data =
                                   (uchar *)((long)pjVar22->stepsizes + lVar89 + -0x10);
                              iVar17 = jpc_putms(enc->out,enc->cstate,pjVar28);
                              if (iVar17 != 0) goto LAB_0011ee4a;
                              (pjVar28->parms).siz.height = 0;
                              jpc_ms_destroy(*ppjVar2);
                              *ppjVar2 = (jpc_ms_t *)0x0;
                              lVar89 = lVar89 + 0x330;
                            }
                            lVar85 = enc->out->rwcnt_ - lVar85;
                            enc->len = enc->len + lVar85;
                            uVar21 = enc->cp->totalsize;
                            uVar25 = lVar85 + 2;
                            uVar23 = uVar21 - uVar25;
                            if (uVar21 < uVar25) {
                              uVar23 = 0;
                            }
                            if (uVar21 == 0xffffffffffffffff) {
                              uVar23 = 0xffffffffffffffff;
                            }
                            enc->mainbodysize = uVar23;
                            local_1758 = enc->cp;
                            local_1778 = "cannot encode main body\n";
                            for (local_1718 = 0; (long)local_1718 < (long)(int)local_1758->numtiles;
                                local_1718 = local_1718 + 1) {
                              image_00 = enc->image;
                              pjVar20 = enc->cp;
                              pjVar34 = (jpc_enc_tile_t *)jas_malloc(0x68);
                              if (pjVar34 == (jpc_enc_tile_t *)0x0) {
LAB_001216e3:
                                *ppjVar50 = (jpc_enc_tile_t *)0x0;
                                pcVar78 = "cannot create tile\n";
LAB_001216f6:
                                jas_eprintf(pcVar78);
                                goto LAB_0011ee60;
                              }
                              pjVar34->tcmpts = (jpc_enc_tcmpt_t *)0x0;
                              pjVar34->lyrsizes = (uint_fast32_t *)0x0;
                              pjVar34->numtcmpts = (uint)pjVar20->numcmpts;
                              pjVar34->pi = (jpc_pi_t *)0x0;
                              pjVar34->tileno = local_1718;
                              uVar25 = local_1718 / pjVar20->numhtiles;
                              uVar56 = local_1718 % pjVar20->numhtiles;
                              uVar23 = pjVar20->tilegrdoffx;
                              uVar49 = pjVar20->tilewidth;
                              uVar21 = uVar49 * uVar56 + uVar23;
                              if (uVar21 <= pjVar20->imgareatlx) {
                                uVar21 = pjVar20->imgareatlx;
                              }
                              pjVar34->tlx = uVar21;
                              uVar80 = pjVar20->tilegrdoffy;
                              uVar55 = pjVar20->tileheight;
                              uVar21 = uVar55 * uVar25 + uVar80;
                              if (uVar21 <= pjVar20->imgareatly) {
                                uVar21 = pjVar20->imgareatly;
                              }
                              pjVar34->tly = uVar21;
                              uVar21 = (uVar56 + 1) * uVar49 + uVar23;
                              if (pjVar20->refgrdwidth <= uVar21) {
                                uVar21 = pjVar20->refgrdwidth;
                              }
                              pjVar34->brx = uVar21;
                              uVar21 = (uVar25 + 1) * uVar55 + uVar80;
                              if (pjVar20->refgrdheight <= uVar21) {
                                uVar21 = pjVar20->refgrdheight;
                              }
                              pjVar34->bry = uVar21;
                              pjVar34->intmode = (pjVar20->tcp).intmode;
                              pjVar34->csty = (pjVar20->tcp).csty;
                              pjVar34->prg = (pjVar20->tcp).prg;
                              pjVar34->mctid = (pjVar20->tcp).mctid;
                              uVar21 = (pjVar20->tcp).numlyrs;
                              pjVar34->numlyrs = (uint)uVar21;
                              puVar35 = (uint_fast32_t *)jas_alloc2(uVar21 & 0xffffffff,8);
                              pjVar34->lyrsizes = puVar35;
                              if (puVar35 == (uint_fast32_t *)0x0) {
LAB_001216d9:
                                jpc_enc_tile_destroy(pjVar34);
                                goto LAB_001216e3;
                              }
                              uVar84 = pjVar34->numlyrs;
                              for (uVar21 = 0; uVar84 != uVar21; uVar21 = uVar21 + 1) {
                                puVar35[uVar21] = 0;
                              }
                              local_17a0 = (jpc_enc_tcmpt_t *)jas_alloc2(pjVar20->numcmpts,0x478);
                              pjVar34->tcmpts = local_17a0;
                              if (local_17a0 == (jpc_enc_tcmpt_t *)0x0) goto LAB_001216d9;
                              uVar40 = pjVar20->numcmpts;
                              ppjVar51 = &local_17a0->tsfb;
                              uVar57 = uVar40;
                              while (bVar93 = uVar57 != 0, uVar57 = uVar57 - 1, bVar93) {
                                *ppjVar51 = (jpc_tsfb_t *)0x0;
                                *(undefined1 (*) [16])(ppjVar51 + -3) = (undefined1  [16])0x0;
                                ppjVar51 = ppjVar51 + 0x8f;
                              }
                              for (local_1748 = 0; local_1748 < uVar40; local_1748 = local_1748 + 1)
                              {
                                local_17a0->tile = pjVar34;
                                local_17a0->tsfb = (jpc_tsfb_t *)0x0;
                                local_17a0->rlvls = (jpc_enc_rlvl_t *)0x0;
                                local_17a0->data = (jas_matrix_t *)0x0;
                                lVar85 = ((long)local_17a0 - (long)pjVar34->tcmpts) / 0x478;
                                pjVar22 = pjVar20->ccps;
                                uVar56 = (ulong)pjVar22[lVar85].sampgrdstepx;
                                uVar21 = (pjVar34->tlx + (uVar56 - 1)) / uVar56;
                                uVar36 = (ulong)pjVar22[lVar85].sampgrdstepy;
                                uVar25 = (pjVar34->tly + (uVar36 - 1)) / uVar36;
                                uVar56 = ((uVar56 - 1) + pjVar34->brx) / uVar56;
                                uVar36 = ((uVar36 - 1) + pjVar34->bry) / uVar36;
                                in_stack_ffffffffffffe838 =
                                     jas_seq2d_create(uVar21,uVar25,uVar56,uVar36);
                                local_17a0->data = in_stack_ffffffffffffe838;
                                if ((in_stack_ffffffffffffe838 == (jas_matrix_t *)0x0) ||
                                   (uVar83 = (ulong)pjVar22[lVar85].sampgrdstepx,
                                   uVar64 = (ulong)pjVar22[lVar85].sampgrdstepy,
                                   iVar17 = jas_image_readcmpt(image_00,(uint)lVar85,
                                                               uVar21 - ((pjVar20->imgareatlx +
                                                                         uVar83) - 1) / uVar83,
                                                               uVar25 - ((pjVar20->imgareatly +
                                                                         uVar64) - 1) / uVar64,
                                                               uVar56 - uVar21,uVar36 - uVar25,
                                                               in_stack_ffffffffffffe838),
                                   iVar17 != 0)) {
LAB_001216cf:
                                  tcmpt_destroy(local_17a0);
                                  goto LAB_001216d9;
                                }
                                local_17a0->synweight = 0;
                                uVar84 = (uint)(pjVar20->tccp).qmfbid;
                                local_17a0->qmfbid = uVar84;
                                bVar47 = (pjVar20->tccp).maxrlvls;
                                local_17a0->numrlvls = (uint)bVar47;
                                local_17a0->numbands = (uint)bVar47 + (uint)bVar47 * 2 + -2;
                                pjVar33 = jpc_cod_gettsfb(uVar84,bVar47 - 1);
                                local_17a0->tsfb = pjVar33;
                                if (pjVar33 == (jpc_tsfb_t *)0x0) goto LAB_001216cf;
                                uVar84 = local_17a0->numrlvls;
                                for (uVar21 = 0; uVar84 != uVar21; uVar21 = uVar21 + 1) {
                                  local_17a0->prcwidthexpns[uVar21] =
                                       (int)(pjVar20->tccp).prcwidthexpns[uVar21];
                                  local_17a0->prcheightexpns[uVar21] =
                                       (int)(pjVar20->tccp).prcheightexpns[uVar21];
                                }
                                uVar40 = (pjVar20->tccp).cblkheightexpn;
                                local_17a0->cblkwidthexpn = (int)(pjVar20->tccp).cblkwidthexpn;
                                local_17a0->cblkheightexpn = (int)uVar40;
                                local_17a0->cblksty = (uint)(pjVar20->tccp).cblksty;
                                local_17a0->csty = (uint)(pjVar20->tccp).csty;
                                iVar17 = local_17a0->numbands;
                                local_17a0->numstepsizes = iVar17;
                                if (100 < (long)iVar17) {
                                  __assert_fail("tcmpt->numstepsizes <= JPC_MAXBANDS",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                ,0x82d,
                                                "jpc_enc_tcmpt_t *tcmpt_create(jpc_enc_tcmpt_t *, jpc_enc_cp_t *, jas_image_t *, jpc_enc_tile_t *)"
                                               );
                                }
                                memset(local_17a0->stepsizes,0,(long)iVar17 << 3);
                                pjVar37 = local_17a0->data;
                                jpc_tsfb_getbands(pjVar33,pjVar37->xstart_,pjVar37->ystart_,
                                                  pjVar37->xend_,pjVar37->yend_,bandinfos);
                                local_17b0 = (jpc_enc_tcmpt_t *)
                                             jas_alloc2((ulong)local_17a0->numrlvls,0x68);
                                local_17a0->rlvls = (jpc_enc_rlvl_t *)local_17b0;
                                if (local_17b0 == (jpc_enc_tcmpt_t *)0x0) goto LAB_001216cf;
                                uVar21 = (ulong)local_17a0->numrlvls;
                                for (lVar85 = 0; uVar21 * 0x68 - lVar85 != 0; lVar85 = lVar85 + 0x68
                                    ) {
                                  *(undefined8 *)
                                   ((long)&((jpc_enc_rlvl_t *)local_17b0)->bands + lVar85) = 0;
                                  *(jpc_enc_tcmpt_t **)
                                   ((long)&((jpc_enc_rlvl_t *)local_17b0)->tcmpt + lVar85) =
                                       local_17a0;
                                }
                                for (local_1738 = 0; local_1738 < uVar21;
                                    local_1738 = local_1738 + 1) {
                                  pjVar69 = local_17a0->rlvls;
                                  lVar85 = ((long)local_17b0 - (long)pjVar69) / 0x68;
                                  *(jpc_enc_band_t **)((long)local_17b0 + 0x58) =
                                       (jpc_enc_band_t *)0x0;
                                  *(jpc_enc_tcmpt_t **)((long)local_17b0 + 0x60) = local_17a0;
                                  pjVar37 = local_17a0->data;
                                  bVar47 = ~(byte)lVar85 + (char)uVar21;
                                  lVar89 = (long)(1 << (bVar47 & 0x1f)) + -1;
                                  uVar36 = pjVar37->xstart_ + lVar89 >> (bVar47 & 0x3f);
                                  *(ulong *)&local_17b0->numrlvls = uVar36;
                                  uVar83 = pjVar37->ystart_ + lVar89 >> (bVar47 & 0x3f);
                                  local_17b0->rlvls = (jpc_enc_rlvl_t *)uVar83;
                                  uVar56 = pjVar37->xend_ + lVar89 >> (bVar47 & 0x3f);
                                  local_17b0->data = (jas_matrix_t *)uVar56;
                                  uVar25 = lVar89 + pjVar37->yend_ >> (bVar47 & 0x3f);
                                  *(ulong *)&local_17b0->qmfbid = uVar25;
                                  if ((uVar36 < uVar56) && (uVar83 < uVar25)) {
                                    uVar84 = (uint)((jpc_enc_tcmpt_t *)pjVar69 != local_17b0);
                                    uVar62 = uVar84 * 2 + 1;
                                    *(uint *)((long)local_17b0 + 0x50) = uVar62;
                                    uVar40 = (pjVar20->tccp).prcwidthexpns[lVar85];
                                    iVar67 = (int)uVar40;
                                    *(int *)&local_17b0->tsfb = iVar67;
                                    uVar57 = (pjVar20->tccp).prcheightexpns[lVar85];
                                    iVar17 = (int)uVar57;
                                    *(int *)((long)local_17b0 + 0x24) = iVar17;
                                    uVar18 = iVar67 - uVar84;
                                    uVar84 = iVar17 - uVar84;
                                    *(uint *)((long)local_17b0 + 0x34) = uVar18;
                                    *(uint *)((long)local_17b0 + 0x38) = uVar84;
                                    uVar21 = (pjVar20->tccp).cblkwidthexpn;
                                    uVar64 = (ulong)uVar18;
                                    if (uVar21 < uVar18) {
                                      uVar64 = uVar21;
                                    }
                                    *(ulong *)((long)local_17b0 + 0x40) = uVar64;
                                    uVar21 = (pjVar20->tccp).cblkheightexpn;
                                    uVar64 = (ulong)uVar84;
                                    if (uVar21 < uVar84) {
                                      uVar64 = uVar21;
                                    }
                                    bVar47 = (byte)uVar40;
                                    iVar19 = -1 << (bVar47 & 0x1f);
                                    if (iVar67 < 1) {
                                      iVar19 = -1;
                                    }
                                    bVar46 = (byte)uVar57;
                                    iVar71 = -1 << (bVar46 & 0x1f);
                                    if (iVar17 < 1) {
                                      iVar71 = -1;
                                    }
                                    *(ulong *)((long)local_17b0 + 0x48) = uVar64;
                                    if (0 < iVar67) {
                                      iVar67 = 1 << (bVar47 & 0x1f);
                                      uVar56 = (long)-iVar67 & (uVar56 + (long)iVar67) - 1;
                                    }
                                    if (0 < iVar17) {
                                      iVar17 = 1 << (bVar46 & 0x1f);
                                      uVar25 = (long)-iVar17 & (uVar25 + (long)iVar17) - 1;
                                    }
                                    iVar67 = (int)(uVar56 - (uVar36 & (long)iVar19) >>
                                                  (bVar47 & 0x3f));
                                    *(int *)&local_17b0->synweight = iVar67;
                                    iVar17 = (int)(uVar25 - (uVar83 & (long)iVar71) >>
                                                  (bVar46 & 0x3f));
                                    *(int *)((long)local_17b0 + 0x2c) = iVar17;
                                    local_17b0->prcwidthexpns[0] = iVar17 * iVar67;
                                    local_17b8 = (jpc_enc_tcmpt_t *)jas_alloc2((ulong)uVar62,0x40);
                                    *(jpc_enc_tcmpt_t **)((long)local_17b0 + 0x58) = local_17b8;
                                    if (local_17b8 == (jpc_enc_tcmpt_t *)0x0) {
LAB_001216c5:
                                      rlvl_destroy((jpc_enc_rlvl_t *)local_17b0);
                                      goto LAB_001216cf;
                                    }
                                    uVar21 = (ulong)*(uint *)((long)local_17b0 + 0x50);
                                    for (lVar85 = 0; uVar21 << 6 != lVar85; lVar85 = lVar85 + 0x40)
                                    {
                                      pauVar73 = (undefined1 (*) [16])
                                                 ((long)&((jpc_enc_band_t *)local_17b8)->prcs +
                                                 lVar85);
                                      *pauVar73 = (undefined1  [16])0x0;
                                      *(jpc_enc_tcmpt_t **)(pauVar73[3] + 8) = local_17b0;
                                    }
                                    for (local_1760 = (jpc_enc_tcmpt_t *)0x0; local_1760 < uVar21;
                                        local_1760 = (jpc_enc_tcmpt_t *)((long)local_1760 + 1)) {
                                      pjVar10 = *(jpc_enc_tcmpt_s **)((long)local_17b0 + 0x60);
                                      local_17b8->numrlvls = 0;
                                      *(undefined4 *)&local_17b8->field_0x4 = 0;
                                      local_17b8->rlvls = (jpc_enc_rlvl_t *)0x0;
                                      *(jpc_enc_tcmpt_t **)((long)local_17b8 + 0x38) = local_17b0;
                                      lVar85 = ((long)local_17b0 - (long)pjVar10->rlvls) / 0x68;
                                      if (local_17b0 == (jpc_enc_tcmpt_t *)pjVar10->rlvls) {
                                        lVar89 = 0;
                                      }
                                      else {
                                        lVar89 = ((long)local_17b8 -
                                                  (long)*(jpc_enc_band_t **)
                                                         ((long)local_17b0 + 0x58) >> 6) +
                                                 lVar85 * 3 + -2;
                                      }
                                      bVar93 = true;
                                      if ((bandinfos[lVar89].xstart != bandinfos[lVar89].xend) &&
                                         (bandinfos[lVar89].ystart != bandinfos[lVar89].yend)) {
                                        pjVar37 = jas_seq2d_create(0,0,0,0);
                                        local_17b8->rlvls = (jpc_enc_rlvl_t *)pjVar37;
                                        if ((pjVar37 != (jas_matrix_t *)0x0) &&
                                           (iVar17 = jas_seq2d_bindsub(pjVar37,pjVar10->data,
                                                                       (long)bandinfos[lVar89].
                                                                             locxstart,
                                                                       (long)bandinfos[lVar89].
                                                                             locystart,
                                                                       (long)bandinfos[lVar89].
                                                                             locxend,
                                                                       (long)bandinfos[lVar89].
                                                                             locyend), iVar17 == 0))
                                        {
                                          pjVar37 = (jas_matrix_t *)local_17b8->rlvls;
                                          lVar52 = (long)bandinfos[lVar89].xstart;
                                          iVar17 = bandinfos[lVar89].ystart;
                                          pjVar37->xstart_ = lVar52;
                                          pjVar37->ystart_ = (long)iVar17;
                                          pjVar37->xend_ = lVar52 + pjVar37->numcols_;
                                          pjVar37->yend_ = (long)iVar17 + pjVar37->numrows_;
                                          bVar93 = pjVar37 == (jas_matrix_t *)0x0;
                                          goto LAB_0011fb2c;
                                        }
LAB_001216bb:
                                        band_destroy((jpc_enc_band_t *)local_17b8);
                                        goto LAB_001216c5;
                                      }
LAB_0011fb2c:
                                      iVar17 = bandinfos[lVar89].orient;
                                      *(int *)&local_17b8->data = iVar17;
                                      iVar17 = JPC_NOMINALGAIN((uint)(pjVar20->tccp).qmfbid,
                                                               pjVar10->numrlvls,(int)lVar85,iVar17)
                                      ;
                                      local_17b8->prcwidthexpns[0] = iVar17;
                                      *(undefined1 (*) [16])((long)local_17b8 + 0x14) =
                                           (undefined1  [16])0x0;
                                      local_17b8->synweight = bandinfos[lVar89].synenergywt;
                                      if (!bVar93) {
                                        pjVar38 = (jpc_enc_prc_t *)
                                                  jas_alloc2((ulong)(uint)local_17b0->prcwidthexpns
                                                                          [0],0x60);
                                        *(jpc_enc_prc_t **)&local_17b8->numrlvls = pjVar38;
                                        if (pjVar38 == (jpc_enc_prc_t *)0x0) goto LAB_001216bb;
                                        uVar21 = (ulong)(uint)local_17b0->prcwidthexpns[0];
                                        for (lVar85 = 0; uVar21 * 0x60 - lVar85 != 0;
                                            lVar85 = lVar85 + 0x60) {
                                          *(undefined8 *)((long)&pjVar38->nlibtree + lVar85) = 0;
                                          *(undefined1 (*) [16])((long)&pjVar38->cblks + lVar85) =
                                               (undefined1  [16])0x0;
                                          *(undefined1 (*) [16])
                                           ((long)&pjVar38->savincltree + lVar85) =
                                               (undefined1  [16])0x0;
                                          *(jpc_enc_tcmpt_t **)((long)&pjVar38->band + lVar85) =
                                               local_17b8;
                                        }
                                        for (local_1750 = 0; local_1750 < uVar21;
                                            local_1750 = local_1750 + 1) {
                                          pjVar38->nlibtree = (jpc_tagtree_t *)0x0;
                                          pjVar38->cblks = (jpc_enc_cblk_t *)0x0;
                                          pjVar38->incltree = (jpc_tagtree_t *)0x0;
                                          pjVar38->savincltree = (jpc_tagtree_t *)0x0;
                                          pjVar38->savnlibtree = (jpc_tagtree_t *)0x0;
                                          pjVar11 = *(jpc_enc_rlvl_s **)((long)local_17b8 + 0x38);
                                          pjVar12 = *(jpc_enc_prc_t **)&local_17b8->numrlvls;
                                          iVar17 = pjVar11->numhprcs;
                                          pjVar13 = pjVar11->tcmpt->rlvls;
                                          pjVar38->band = (jpc_enc_band_s *)local_17b8;
                                          iVar67 = -1 << ((byte)pjVar11->prcwidthexpn & 0x1f);
                                          if (pjVar11->prcwidthexpn < 1) {
                                            iVar67 = -1;
                                          }
                                          uVar21 = (long)iVar67 & pjVar11->tlx;
                                          iVar67 = -1 << ((byte)pjVar11->prcheightexpn & 0x1f);
                                          if (pjVar11->prcheightexpn < 1) {
                                            iVar67 = -1;
                                          }
                                          uVar56 = (long)iVar67 & pjVar11->tly;
                                          uVar25 = uVar21 + 1 >> 1;
                                          if (pjVar11 == pjVar13) {
                                            uVar25 = uVar21;
                                          }
                                          uVar21 = uVar56 + 1 >> 1;
                                          if (pjVar11 == pjVar13) {
                                            uVar21 = uVar56;
                                          }
                                          uVar56 = ((long)pjVar38 - (long)pjVar12) / 0x60;
                                          bVar47 = (byte)pjVar11->cbgwidthexpn;
                                          bVar46 = (byte)pjVar11->cbgheightexpn;
                                          uVar25 = (uVar56 % (ulong)(long)iVar17 << (bVar47 & 0x3f))
                                                   + uVar25;
                                          uVar21 = (uVar56 / (ulong)(long)iVar17 << (bVar46 & 0x3f))
                                                   + uVar21;
                                          pjVar37 = (jas_matrix_t *)local_17b8->rlvls;
                                          uVar56 = pjVar37->xstart_;
                                          if (pjVar37->xstart_ <= (long)uVar25) {
                                            uVar56 = uVar25;
                                          }
                                          pjVar38->tlx = uVar56;
                                          uVar36 = pjVar37->ystart_;
                                          if (pjVar37->ystart_ <= (long)uVar21) {
                                            uVar36 = uVar21;
                                          }
                                          pjVar38->tly = uVar36;
                                          uVar25 = (long)(1 << (bVar47 & 0x1f)) + uVar25;
                                          if (pjVar37->xend_ < (long)uVar25) {
                                            uVar25 = pjVar37->xend_;
                                          }
                                          pjVar38->brx = uVar25;
                                          uVar21 = (long)(1 << (bVar46 & 0x1f)) + uVar21;
                                          if (pjVar37->yend_ < (long)uVar21) {
                                            uVar21 = pjVar37->yend_;
                                          }
                                          pjVar38->bry = uVar21;
                                          if ((uVar56 < uVar25) && (uVar36 < uVar21)) {
                                            bVar47 = (byte)pjVar11->cblkwidthexpn;
                                            bVar46 = (byte)pjVar11->cblkheightexpn;
                                            if (pjVar11->cblkwidthexpn != 0) {
                                              iVar17 = 1 << (bVar47 & 0x1f);
                                              uVar25 = (long)-iVar17 & (uVar25 + (long)iVar17) - 1;
                                            }
                                            if (pjVar11->cblkheightexpn != 0) {
                                              iVar17 = 1 << (bVar46 & 0x1f);
                                              uVar21 = (long)-iVar17 & (uVar21 + (long)iVar17) - 1;
                                            }
                                            iVar67 = (int)(uVar25 - (uVar56 & (long)(-1 << (bVar47 &
                                                                                           0x1f)))
                                                          >> (bVar47 & 0x3f));
                                            pjVar38->numhcblks = iVar67;
                                            iVar17 = (int)(uVar21 - (uVar36 & (long)(-1 << (bVar46 &
                                                                                           0x1f)))
                                                          >> (bVar46 & 0x3f));
                                            pjVar38->numvcblks = iVar17;
                                            pjVar38->numcblks = iVar17 * iVar67;
                                            pjVar39 = jpc_tagtree_create(iVar67,iVar17);
                                            pjVar38->incltree = pjVar39;
                                            if (pjVar39 != (jpc_tagtree_t *)0x0) {
                                              pjVar39 = jpc_tagtree_create(pjVar38->numhcblks,
                                                                           pjVar38->numvcblks);
                                              pjVar38->nlibtree = pjVar39;
                                              if (pjVar39 != (jpc_tagtree_t *)0x0) {
                                                pjVar39 = jpc_tagtree_create(pjVar38->numhcblks,
                                                                             pjVar38->numvcblks);
                                                pjVar38->savincltree = pjVar39;
                                                if (pjVar39 != (jpc_tagtree_t *)0x0) {
                                                  pjVar39 = jpc_tagtree_create(pjVar38->numhcblks,
                                                                               pjVar38->numvcblks);
                                                  pjVar38->savnlibtree = pjVar39;
                                                  if (pjVar39 != (jpc_tagtree_t *)0x0) {
                                                    cmptno_1 = (uint_fast16_t)
                                                               jas_alloc2((ulong)pjVar38->numcblks,
                                                                          0x68);
                                                    pjVar38->cblks = (jpc_enc_cblk_t *)cmptno_1;
                                                    if ((jpc_enc_cblk_t *)cmptno_1 !=
                                                        (jpc_enc_cblk_t *)0x0) {
                                                      uVar21 = (ulong)pjVar38->numcblks;
                                                      for (lVar85 = 0; uVar21 * 0x68 - lVar85 != 0;
                                                          lVar85 = lVar85 + 0x68) {
                                                        *(undefined8 *)
                                                         ((long)&((jpc_enc_cblk_t *)cmptno_1)->
                                                                 passes + lVar85) = 0;
                                                        *(undefined1 (*) [16])
                                                         ((long)&((jpc_enc_cblk_t *)cmptno_1)->
                                                                 stream + lVar85) =
                                                             (undefined1  [16])0x0;
                                                        *(undefined1 (*) [16])
                                                         ((long)&((jpc_enc_cblk_t *)cmptno_1)->data
                                                         + lVar85) = (undefined1  [16])0x0;
                                                        *(jpc_enc_prc_t **)
                                                         ((long)&((jpc_enc_cblk_t *)cmptno_1)->prc +
                                                         lVar85) = pjVar38;
                                                      }
                                                      local_1780 = (jpc_enc_rlvl_t *)cmptno_1;
                                                      for (local_1788 = (jpc_enc_tcmpt_t *)0x0;
                                                          local_1788 < uVar21;
                                                          local_1788 = (jpc_enc_tcmpt_t *)
                                                                       ((long)local_1788 + 1)) {
                                                        uVar36 = ((long)local_1780 -
                                                                 (long)pjVar38->cblks) / 0x68;
                                                        uVar83 = uVar36 / (ulong)(long)pjVar38->
                                                  numhcblks;
                                                  uVar36 = uVar36 % (ulong)(long)pjVar38->numhcblks;
                                                  pjVar14 = pjVar38->band;
                                                  pjVar11 = pjVar14->rlvl;
                                                  *(jpc_enc_prc_t **)(cmptno_1 + 0x50) = pjVar38;
                                                  *(undefined4 *)cmptno_1 = 0;
                                                  *(undefined8 *)(cmptno_1 + 0x48) = 0;
                                                  *(undefined4 *)(cmptno_1 + 0x18) = 0;
                                                  *(undefined1 (*) [16])(cmptno_1 + 8) =
                                                       (undefined1  [16])0x0;
                                                  *(undefined1 (*) [16])(cmptno_1 + 0x20) =
                                                       (undefined1  [16])0x0;
                                                  *(undefined1 (*) [16])(cmptno_1 + 0x30) =
                                                       (undefined1  [16])0x0;
                                                  *(undefined4 *)(cmptno_1 + 0x40) = 0;
                                                  *(undefined1 (*) [16])(cmptno_1 + 0x58) =
                                                       (undefined1  [16])0x0;
                                                  bVar47 = (byte)pjVar11->cblkwidthexpn;
                                                  bVar46 = (byte)pjVar11->cblkheightexpn;
                                                  uVar21 = pjVar38->tlx;
                                                  uVar25 = (long)(-1 << (bVar47 & 0x1f)) & uVar21;
                                                  uVar56 = (uVar36 << (bVar47 & 0x3f)) + uVar25;
                                                  if (uVar56 <= uVar21) {
                                                    uVar56 = uVar21;
                                                  }
                                                  uVar21 = pjVar38->tly;
                                                  uVar86 = (long)(-1 << (bVar46 & 0x1f)) & uVar21;
                                                  uVar64 = (uVar83 << (bVar46 & 0x3f)) + uVar86;
                                                  if (uVar64 <= uVar21) {
                                                    uVar64 = uVar21;
                                                  }
                                                  uVar25 = uVar25 + (uVar36 + 1 << (bVar47 & 0x3f));
                                                  if (pjVar38->brx <= uVar25) {
                                                    uVar25 = pjVar38->brx;
                                                  }
                                                  uVar86 = uVar86 + (uVar83 + 1 << (bVar46 & 0x3f));
                                                  if (pjVar38->bry <= uVar86) {
                                                    uVar86 = pjVar38->bry;
                                                  }
                                                  if ((uVar25 <= uVar56) || (uVar86 <= uVar64)) {
                                                    __assert_fail(
                                                  "cblktlx < cblkbrx && cblktly < cblkbry",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x9fd,
                                                  "jpc_enc_cblk_t *cblk_create(jpc_enc_cblk_t *, jpc_enc_prc_t *)"
                                                  );
                                                  }
                                                  pjVar37 = jas_seq2d_create(0,0,0,0);
                                                  *(jas_matrix_t **)(cmptno_1 + 0x30) = pjVar37;
                                                  if ((pjVar37 == (jas_matrix_t *)0x0) ||
                                                     (iVar17 = jas_seq2d_bindsub(pjVar37,pjVar14->
                                                  data,uVar56,uVar64,uVar25,uVar86), iVar17 != 0)) {
                                                    cblk_destroy((jpc_enc_cblk_t *)cmptno_1);
                                                    goto LAB_001216b3;
                                                  }
                                                  cmptno_1 = cmptno_1 + 0x68;
                                                  uVar21 = (ulong)pjVar38->numcblks;
                                                  local_1780 = local_1780 + 1;
                                                  }
                                                  goto LAB_0011fe70;
                                                  }
                                                  }
                                                }
                                              }
                                            }
LAB_001216b3:
                                            prc_destroy(pjVar38);
                                            goto LAB_001216bb;
                                          }
                                          pjVar38->tlx = uVar25;
                                          pjVar38->tly = uVar21;
                                          pjVar38->numcblks = 0;
                                          pjVar38->numhcblks = 0;
                                          pjVar38->numvcblks = 0;
                                          pjVar38->cblks = (jpc_enc_cblk_t *)0x0;
                                          pjVar38->incltree = (jpc_tagtree_t *)0x0;
                                          pjVar38->nlibtree = (jpc_tagtree_t *)0x0;
                                          pjVar38->savincltree = (jpc_tagtree_t *)0x0;
                                          pjVar38->savnlibtree = (jpc_tagtree_t *)0x0;
LAB_0011fe70:
                                          pjVar38 = pjVar38 + 1;
                                          uVar21 = (ulong)(uint)local_17b0->prcwidthexpns[0];
                                        }
                                      }
                                      local_17b8 = (jpc_enc_tcmpt_t *)((long)local_17b8 + 0x40);
                                      uVar21 = (ulong)*(uint *)((long)local_17b0 + 0x50);
                                    }
                                    uVar21 = (ulong)local_17a0->numrlvls;
                                  }
                                  else {
                                    local_17b0->synweight = 0;
                                    local_17b0->prcwidthexpns[0] = 0;
                                  }
                                  local_17b0 = (jpc_enc_tcmpt_t *)((long)local_17b0 + 0x68);
                                }
                                local_17a0 = local_17a0 + 1;
                                uVar40 = pjVar20->numcmpts;
                              }
                              pjVar96 = pjVar34->tcmpts;
                              if (pjVar34->mctid == '\x01') {
                                jVar74 = 0x3259;
                                jVar58 = 0x39c3;
LAB_00120064:
                                pjVar96->synweight = 0x376c;
                                pjVar96[1].synweight = jVar58;
                                pjVar96[2].synweight = jVar74;
                              }
                              else {
                                jVar58 = 0x1a88;
                                jVar74 = 0x1a88;
                                if (pjVar34->mctid == '\x02') goto LAB_00120064;
                                pjVar26 = &pjVar96->synweight;
                                while (bVar93 = uVar40 != 0, uVar40 = uVar40 - 1, bVar93) {
                                  *pjVar26 = 0x2000;
                                  pjVar26 = pjVar26 + 0x8f;
                                }
                              }
                              pjVar41 = jpc_enc_pi_create(pjVar20,pjVar34);
                              pjVar34->pi = pjVar41;
                              if (pjVar41 == (jpc_pi_t *)0x0) goto LAB_001216d9;
                              *ppjVar50 = pjVar34;
                              iVar17 = jas_getdbglevel();
                              tcmpt = pjVar34->tcmpts;
                              if (iVar17 < 10) {
                                uVar21 = (ulong)pjVar34->numtcmpts;
                              }
                              else {
                                for (cmptno_1 = 0; uVar21 = (ulong)pjVar34->numtcmpts,
                                    cmptno_1 < uVar21; cmptno_1 = cmptno_1 + 1) {
                                  pjVar37 = tcmpt->data;
                                  jas_eprintf("  tcmpt %5d %5d %5d %5d\n",pjVar37->xstart_,
                                              pjVar37->ystart_,pjVar37->xend_);
                                  pjVar69 = tcmpt->rlvls;
                                  for (local_17b8 = (jpc_enc_tcmpt_t *)0x0;
                                      local_17b8 < (ulong)tcmpt->numrlvls;
                                      local_17b8 = (jpc_enc_tcmpt_t *)((long)local_17b8 + 1)) {
                                    jas_eprintf("    rlvl %5d %5d %5d %5d\n",pjVar69->tlx,
                                                pjVar69->tly,pjVar69->brx);
                                    local_17b0 = (jpc_enc_tcmpt_t *)pjVar69->bands;
                                    for (local_17a0 = (jpc_enc_tcmpt_t *)0x0;
                                        local_17a0 < (ulong)pjVar69->numbands;
                                        local_17a0 = (jpc_enc_tcmpt_t *)((long)local_17a0 + 1)) {
                                      pjVar37 = (jas_matrix_t *)local_17b0->rlvls;
                                      if (pjVar37 != (jas_matrix_t *)0x0) {
                                        jas_eprintf("      band %5d %5d %5d %5d\n",pjVar37->xstart_,
                                                    pjVar37->ystart_,pjVar37->xend_);
                                        pjVar38 = *(jpc_enc_prc_t **)&local_17b0->numrlvls;
                                        for (uVar21 = 0; uVar21 < pjVar69->numprcs;
                                            uVar21 = uVar21 + 1) {
                                          in_stack_ffffffffffffe838 =
                                               (jas_matrix_t *)(pjVar38->bry - pjVar38->tly);
                                          jas_eprintf("        prc %5d %5d %5d %5d (%5d %5d)\n");
                                          if (pjVar38->cblks != (jpc_enc_cblk_t *)0x0) {
                                            ppjVar88 = &pjVar38->cblks->data;
                                            for (uVar25 = 0; uVar25 < pjVar38->numcblks;
                                                uVar25 = uVar25 + 1) {
                                              pjVar37 = *ppjVar88;
                                              jas_eprintf("         cblk %5d %5d %5d %5d\n",
                                                          pjVar37->xstart_,pjVar37->ystart_,
                                                          pjVar37->xend_);
                                              ppjVar88 = ppjVar88 + 0xd;
                                            }
                                          }
                                          pjVar38 = pjVar38 + 1;
                                        }
                                      }
                                      local_17b0 = (jpc_enc_tcmpt_t *)((long)local_17b0 + 0x40);
                                    }
                                    pjVar69 = pjVar69 + 1;
                                  }
                                  tcmpt = tcmpt + 1;
                                }
                                tcmpt = pjVar34->tcmpts;
                              }
                              pjVar96 = tcmpt;
                              for (uVar25 = 0; uVar25 != uVar21; uVar25 = uVar25 + 1) {
                                if (local_1758->ccps[uVar25].sgnd == false) {
                                  uVar16 = local_1758->ccps[uVar25].prec;
                                  pjVar37 = pjVar96->data;
                                  for (lVar85 = 0; lVar85 < pjVar37->numrows_; lVar85 = lVar85 + 1)
                                  {
                                    for (lVar89 = 0; lVar89 < pjVar37->numcols_; lVar89 = lVar89 + 1
                                        ) {
                                      pjVar37->rows_[lVar85][lVar89] =
                                           pjVar37->rows_[lVar85][lVar89] -
                                           (long)(1 << (uVar16 - 1 & 0x1f));
                                    }
                                  }
                                }
                                pjVar96 = pjVar96 + 1;
                              }
                              if (pjVar34->intmode == false) {
                                for (lVar85 = uVar21 * 0x478; lVar85 != 0; lVar85 = lVar85 + -0x478)
                                {
                                  jas_matrix_asl(tcmpt->data,0xd);
                                  tcmpt = tcmpt + 1;
                                }
                              }
                              if (pjVar34->mctid == '\x01') {
                                if (enc->image->numcmpts_ != 3) {
                                  __assert_fail("jas_image_numcmpts(enc->image) == 3",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                ,0x48d,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                                }
                                pjVar96 = pjVar34->tcmpts;
                                jpc_ict(pjVar96->data,pjVar96[1].data,pjVar96[2].data);
                              }
                              else if (pjVar34->mctid == '\x02') {
                                if (enc->image->numcmpts_ != 3) {
                                  __assert_fail("jas_image_numcmpts(enc->image) == 3",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                ,0x488,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                                }
                                pjVar96 = pjVar34->tcmpts;
                                jpc_rct(pjVar96->data,pjVar96[1].data,pjVar96[2].data);
                              }
                              lVar85 = 0x20;
                              for (uVar21 = 0; local_17b8 = pjVar34->tcmpts,
                                  uVar21 < enc->image->numcmpts_; uVar21 = uVar21 + 1) {
                                jpc_tsfb_analyze(*(jpc_tsfb_t **)
                                                  ((long)local_17b8->prcwidthexpns + lVar85 + -0x30)
                                                 ,*(jas_seq2d_t **)
                                                   ((long)local_17b8->prcwidthexpns + lVar85 + -0x40
                                                   ));
                                lVar85 = lVar85 + 0x478;
                              }
                              pjVar96 = local_17b8 + pjVar34->numtcmpts;
                              local_1788 = (jpc_enc_tcmpt_t *)0x0;
                              for (; local_17b8 != pjVar96; local_17b8 = local_17b8 + 1) {
                                local_17a0 = (jpc_enc_tcmpt_t *)0x0;
                                memset(local_17b8->stepsizes,0,800);
                                local_1768 = (jpc_enc_tcmpt_t *)local_17b8->rlvls;
                                uVar62 = local_17b8->numrlvls;
                                local_17b0 = (jpc_enc_tcmpt_t *)0x0;
                                for (uVar84 = 0; uVar84 != uVar62; uVar84 = uVar84 + 1) {
                                  pjVar77 = *(jpc_enc_band_t **)((long)local_1768 + 0x58);
                                  if (pjVar77 == (jpc_enc_band_t *)0x0) {
                                    local_17a0 = (jpc_enc_tcmpt_t *)
                                                 (ulong)((int)local_17a0 + (uint)(uVar84 != 0) * 2 +
                                                        1);
                                  }
                                  else {
                                    pjVar42 = pjVar77 + *(uint *)((long)local_1768 + 0x50);
                                    local_17a0 = (jpc_enc_tcmpt_t *)(long)(int)local_17a0;
                                    for (; pjVar77 != pjVar42; pjVar77 = pjVar77 + 1) {
                                      pjVar37 = pjVar77->data;
                                      if (pjVar37 != (jas_matrix_t *)0x0) {
                                        lVar85 = pjVar37->numrows_;
                                        lVar89 = 0;
                                        if (0 < lVar85) {
                                          lVar89 = lVar85;
                                        }
                                        lVar52 = 0;
                                        for (lVar53 = 0; lVar53 != lVar89; lVar53 = lVar53 + 1) {
                                          lVar59 = pjVar37->numcols_;
                                          if (lVar59 < 1) {
                                            lVar59 = 0;
                                          }
                                          for (lVar75 = 0; lVar59 != lVar75; lVar75 = lVar75 + 1) {
                                            lVar90 = pjVar37->rows_[lVar53][lVar75];
                                            lVar68 = -lVar90;
                                            if (0 < lVar90) {
                                              lVar68 = lVar90;
                                            }
                                            if (lVar52 < lVar68) {
                                              lVar52 = lVar68;
                                            }
                                          }
                                        }
                                        _Var7 = pjVar34->intmode;
                                        iVar19 = jpc_fix_firstone(lVar52);
                                        iVar71 = (uint)local_1758->ccps[(long)local_1788].prec +
                                                 pjVar77->analgain;
                                        iVar67 = iVar19 + 1;
                                        if (_Var7 == false) {
                                          iVar67 = iVar19 + -0xc;
                                        }
                                        uVar18 = (iVar67 - iVar71) + 1;
                                        uVar21 = (ulong)uVar18;
                                        if ((int)uVar18 <= (int)local_17b0) {
                                          uVar21 = (ulong)local_17b0;
                                        }
                                        lVar89 = 0x2000;
                                        if (_Var7 == false) {
                                          lVar89 = ((long)(0x2000 <<
                                                          ((char)pjVar77->analgain + 1U & 0x1f)) <<
                                                   0xd) / pjVar77->synweight;
                                        }
                                        pjVar77->absstepsize = lVar89;
                                        uVar23 = jpc_abstorelstepsize(lVar89,iVar71);
                                        if (uVar23 == 0xffffffffffffffff) goto LAB_0011ee60;
                                        pjVar77->stepsize = (int)uVar23;
                                        pjVar77->numbps =
                                             (uint)(local_1758->tccp).numgbits +
                                             ((uint)(uVar23 >> 0xb) & 0x1fffff) + -1;
                                        if (lVar89 != 0x2000 && _Var7 == false) {
                                          for (lVar52 = 0; lVar52 < lVar85; lVar52 = lVar52 + 1) {
                                            for (lVar85 = 0; lVar85 < pjVar37->numcols_;
                                                lVar85 = lVar85 + 1) {
                                              lVar53 = pjVar37->rows_[lVar52][lVar85];
                                              if (lVar53 < 0) {
                                                jVar43 = -((lVar53 * -0x2000) / lVar89);
                                              }
                                              else {
                                                jVar43 = (lVar53 << 0xd) / lVar89;
                                              }
                                              pjVar37->rows_[lVar52][lVar85] = jVar43;
                                            }
                                            lVar85 = pjVar37->numrows_;
                                          }
                                        }
                                        local_17b8->stepsizes[(long)local_17a0] = uVar23;
                                        local_17b0 = (jpc_enc_tcmpt_t *)uVar21;
                                      }
                                      local_17a0 = (jpc_enc_tcmpt_t *)((long)local_17a0 + 1);
                                    }
                                  }
                                  local_1768 = (jpc_enc_tcmpt_t *)((long)local_1768 + 0x68);
                                }
                                if (pjVar34->intmode == false) {
                                  jas_matrix_divpow2(local_17b8->data,7);
                                }
                                else {
                                  jas_matrix_asl(local_17b8->data,6);
                                }
                                if ((int)(uint)(local_1758->tccp).numgbits < (int)local_17b0) {
                                  jas_eprintf("error: too few guard bits (need at least %d)\n",
                                              local_17b0);
                                  goto LAB_0011ee60;
                                }
                                local_1788 = (jpc_enc_tcmpt_t *)((long)local_1788 + 1);
                              }
                              pjVar44 = jas_stream_memopen((char *)0x0,0);
                              enc->tmpstream = pjVar44;
                              if (pjVar44 == (jas_stream_t *)0x0) {
                                pcVar78 = "cannot open tmp file\n";
                                goto LAB_001216f6;
                              }
                              pjVar28 = jpc_ms_create(0xff90);
                              *ppjVar2 = pjVar28;
                              if (pjVar28 == (jpc_ms_t *)0x0) goto LAB_0011ee60;
                              (pjVar28->parms).sot.len = 0;
                              (pjVar28->parms).sot.tileno = local_1718;
                              *(undefined2 *)((long)&pjVar28->parms + 0x10) = 0x100;
                              iVar67 = jpc_putms(enc->tmpstream,enc->cstate,pjVar28);
                              if (iVar67 != 0) {
                                pcVar78 = "cannot write SOT marker\n";
                                goto LAB_001216f6;
                              }
                              jpc_ms_destroy(*ppjVar2);
                              *ppjVar2 = (jpc_ms_t *)0x0;
                              uVar84 = 0;
                              while( true ) {
                                uVar40 = local_1758->numcmpts;
                                pjVar96 = pjVar34->tcmpts;
                                if (uVar40 <= uVar84) break;
                                if (pjVar96[uVar84].numrlvls != (uint)(local_1758->tccp).maxrlvls) {
                                  pjVar28 = jpc_ms_create(0xff52);
                                  *ppjVar2 = pjVar28;
                                  if (pjVar28 == (jpc_ms_t *)0x0) goto LAB_0011ee60;
                                  pjVar96 = pjVar34->tcmpts;
                                  (pjVar28->parms).cod.compparms.csty = '\0';
                                  uVar62 = pjVar96->numrlvls;
                                  (pjVar28->parms).cod.compparms.numdlvls = (char)uVar62 + 0xff;
                                  (pjVar28->parms).cod.prg = pjVar34->prg;
                                  *(ulong *)((long)&pjVar28->parms + 8) = (ulong)pjVar34->numlyrs;
                                  (pjVar28->parms).cod.compparms.cblkwidthval =
                                       (char)pjVar96->cblkwidthexpn + 0xfe;
                                  (pjVar28->parms).cod.compparms.cblkheightval =
                                       (char)pjVar96->cblkheightexpn + 0xfe;
                                  (pjVar28->parms).cod.compparms.cblksty =
                                       (uint_fast8_t)pjVar96->cblksty;
                                  (pjVar28->parms).cod.compparms.qmfbid =
                                       (uint_fast8_t)pjVar96->qmfbid;
                                  (pjVar28->parms).sot.partno = pjVar34->mctid != '\0';
                                  puVar30 = &(pjVar28->parms).cod.compparms.rlvls[0].parheightval;
                                  for (lVar85 = 0; (ulong)uVar62 * 0x68 - lVar85 != 0;
                                      lVar85 = lVar85 + 0x68) {
                                    pjVar69 = pjVar96->rlvls;
                                    ((jpc_coxrlvl_t *)(puVar30 + -1))->parwidthval =
                                         *(uint_fast8_t *)((long)&pjVar69->prcwidthexpn + lVar85);
                                    *puVar30 = *(uint_fast8_t *)
                                                ((long)&pjVar69->prcheightexpn + lVar85);
                                    puVar30 = puVar30 + 2;
                                  }
                                  iVar67 = jpc_putms(enc->tmpstream,enc->cstate,pjVar28);
                                  if (iVar67 != 0) goto LAB_0011ee60;
                                  jpc_ms_destroy(*ppjVar2);
                                  *ppjVar2 = (jpc_ms_t *)0x0;
                                }
                                uVar84 = uVar84 + 1;
                              }
                              for (uVar84 = 0; uVar21 = (ulong)uVar84, uVar21 < uVar40;
                                  uVar84 = uVar84 + 1) {
                                uVar62 = (uint)local_1758->ccps[uVar21].numstepsizes;
                                if (pjVar96->numstepsizes == uVar62) {
                                  uVar25 = (ulong)uVar62;
                                  if ((int)uVar62 < 1) {
                                    uVar25 = 0;
                                  }
                                  uVar56 = 0;
                                  do {
                                    if (uVar25 == uVar56) goto LAB_00120906;
                                    puVar1 = local_1758->ccps[uVar21].stepsizes + uVar56;
                                    puVar6 = pjVar96->stepsizes + uVar56;
                                    uVar56 = uVar56 + 1;
                                  } while (*puVar1 == *puVar6);
                                }
                                pjVar28 = jpc_ms_create(0xff5d);
                                *ppjVar2 = pjVar28;
                                if (pjVar28 == (jpc_ms_t *)0x0) goto LAB_0011ee60;
                                (pjVar28->parms).sot.tileno = uVar21;
                                (pjVar28->parms).cod.compparms.cblksty = (local_1758->tccp).numgbits
                                ;
                                (pjVar28->parms).coc.compparms.csty =
                                     (pjVar96->qmfbid == 0) * '\x02';
                                *(int *)((long)&pjVar28->parms + 0xc) = pjVar96->numstepsizes;
                                (pjVar28->parms).ppm.data = (uchar *)pjVar96->stepsizes;
                                iVar67 = jpc_putms(enc->tmpstream,enc->cstate,pjVar28);
                                if (iVar67 != 0) goto LAB_0011ee60;
                                (pjVar28->parms).siz.height = 0;
                                jpc_ms_destroy(*ppjVar2);
                                *ppjVar2 = (jpc_ms_t *)0x0;
                                uVar40 = local_1758->numcmpts;
LAB_00120906:
                                pjVar96 = pjVar96 + 1;
                              }
                              pjVar28 = jpc_ms_create(0xff93);
                              *ppjVar2 = pjVar28;
                              if (pjVar28 == (jpc_ms_t *)0x0) goto LAB_0011ee60;
                              iVar67 = jpc_putms(enc->tmpstream,enc->cstate,pjVar28);
                              if (iVar67 != 0) {
                                pcVar78 = "cannot write SOD marker\n";
                                goto LAB_001216f6;
                              }
                              jpc_ms_destroy(enc->mrk);
                              enc->mrk = (jpc_ms_t *)0x0;
                              uVar21 = enc->tmpstream->rwcnt_;
                              if ((long)uVar21 < 0) {
                                __assert_fail("tilehdrlen >= 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                              ,0x557,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                              }
                              iVar67 = jpc_enc_enccblks(enc);
                              if (iVar67 != 0) goto LAB_0012179a;
                              local_1758 = enc->cp;
                              uVar25 = pjVar34->brx - pjVar34->tlx;
                              uVar56 = pjVar34->bry - pjVar34->tly;
                              lVar85 = (local_1758->refgrdheight - local_1758->imgareatly) *
                                       (local_1758->refgrdwidth - local_1758->imgareatlx);
                              auVar100._8_4_ = (int)((ulong)lVar85 >> 0x20);
                              auVar100._0_8_ = lVar85;
                              auVar100._12_4_ = 0x45300000;
                              dVar94 = ((((double)(uVar56 >> 0x20 | 0x4530000000000000) -
                                         1.9342813118337666e+25) +
                                        (double)(uVar56 & 0xffffffff | 0x4330000000000000)) *
                                       (((double)(uVar25 >> 0x20 | 0x4530000000000000) -
                                        1.9342813118337666e+25) +
                                       (double)(uVar25 & 0xffffffff | 0x4330000000000000))) /
                                       ((auVar100._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar85) -
                                       4503599627370496.0));
                              uVar23 = local_1758->rawsize;
                              auVar101._8_4_ = (int)(uVar23 >> 0x20);
                              auVar101._0_8_ = uVar23;
                              auVar101._12_4_ = 0x45300000;
                              dVar104 = ((auVar101._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)uVar23) -
                                        4503599627370496.0)) * dVar94;
                              uVar25 = (ulong)dVar104;
                              pjVar34->rawsize =
                                   (long)(dVar104 - 9.223372036854776e+18) & (long)uVar25 >> 0x3f |
                                   uVar25;
                              uVar84 = pjVar34->numlyrs;
                              uVar25 = (ulong)(uVar84 - 1);
                              for (uVar56 = 0; uVar25 != uVar56; uVar56 = uVar56 + 1) {
                                auVar102._0_8_ = (double)CONCAT44(0x43300000,(int)pjVar34->rawsize);
                                auVar102._8_4_ = (int)(pjVar34->rawsize >> 0x20);
                                auVar102._12_4_ = 0x45300000;
                                dVar104 = (double)(local_1758->tcp).ilyrrates[uVar56] *
                                          0.0001220703125 *
                                          ((auVar102._8_8_ - 1.9342813113834067e+25) +
                                          (auVar102._0_8_ - 4503599627370496.0));
                                uVar36 = (ulong)dVar104;
                                pjVar34->lyrsizes[uVar56] =
                                     (long)(dVar104 - 9.223372036854776e+18) & (long)uVar36 >> 0x3f
                                     | uVar36;
                              }
                              uVar23 = 0xffffffffffffffff;
                              if (local_1758->totalsize != 0xffffffffffffffff) {
                                auVar103._0_8_ = (double)CONCAT44(0x43300000,(int)enc->mainbodysize)
                                ;
                                auVar103._8_4_ = (int)(enc->mainbodysize >> 0x20);
                                auVar103._12_4_ = 0x45300000;
                                dVar94 = dVar94 * ((auVar103._8_8_ - 1.9342813113834067e+25) +
                                                  (auVar103._0_8_ - 4503599627370496.0));
                                uVar56 = (ulong)dVar94;
                                uVar23 = (long)(dVar94 - 9.223372036854776e+18) &
                                         (long)uVar56 >> 0x3f | uVar56;
                              }
                              puVar35 = pjVar34->lyrsizes;
                              puVar35[uVar25] = uVar23;
                              for (uVar56 = 0; uVar84 != uVar56; uVar56 = uVar56 + 1) {
                                uVar36 = puVar35[uVar56];
                                if (uVar36 != 0xffffffffffffffff) {
                                  uVar23 = 0;
                                  if (uVar21 <= uVar36) {
                                    uVar23 = uVar36 - uVar21;
                                  }
                                  puVar35[uVar56] = uVar23;
                                }
                              }
                              if (9 < iVar17) {
                                jas_eprintf("starting rate allocation\n");
                              }
                              pjVar34 = *ppjVar50;
                              uVar21 = 1;
                              while (uVar21 < uVar25) {
                                lVar85 = uVar21 - 1;
                                puVar5 = puVar35 + uVar21;
                                uVar21 = uVar21 + 1;
                                if (*puVar5 < puVar35[lVar85]) goto LAB_0012179a;
                              }
                              pjVar44 = jas_stream_memopen((char *)0x0,0);
                              if (pjVar44 == (jas_stream_t *)0x0) goto LAB_0011ee60;
                              local_1760 = pjVar34->tcmpts;
                              pjVar96 = local_1760 + pjVar34->numtcmpts;
                              local_17b0 = (jpc_enc_tcmpt_t *)0x0;
                              local_17a0 = (jpc_enc_tcmpt_t *)0x7fefffffffffffff;
                              for (; local_1760 != pjVar96; local_1760 = local_1760 + 1) {
                                local_1780 = local_1760->rlvls;
                                pjVar69 = local_1780 + local_1760->numrlvls;
                                for (; local_1780 != pjVar69; local_1780 = local_1780 + 1) {
                                  cmptno_1 = (uint_fast16_t)local_1780->bands;
                                  if ((jpc_enc_band_t *)cmptno_1 != (jpc_enc_band_t *)0x0) {
                                    pjVar77 = (jpc_enc_band_t *)
                                              (cmptno_1 + (ulong)local_1780->numbands * 0x40);
                                    for (; (jpc_enc_band_t *)cmptno_1 != pjVar77;
                                        cmptno_1 = cmptno_1 + 0x40) {
                                      if (*(long *)(cmptno_1 + 8) != 0) {
                                        lVar85 = *(long *)cmptno_1;
                                        uVar18 = local_1780->numprcs;
                                        for (uVar62 = 0; uVar62 != uVar18; uVar62 = uVar62 + 1) {
                                          puVar65 = *(uint **)(lVar85 + 0x30);
                                          if (puVar65 != (uint *)0x0) {
                                            puVar87 = puVar65 + (ulong)*(uint *)(lVar85 + 0x28) *
                                                                0x1a;
                                            for (; puVar65 != puVar87; puVar65 = puVar65 + 0x1a) {
                                              uVar21 = *(ulong *)(puVar65 + 2);
                                              lVar89 = (ulong)*puVar65 * 0x48;
                                              dVar94 = 0.0;
                                              uVar56 = uVar21;
LAB_00120d14:
                                              if (uVar56 != uVar21 + lVar89) {
                                                uVar83 = 0;
                                                uVar36 = uVar21;
                                                for (lVar52 = lVar89; uVar64 = uVar36 + 0x48,
                                                    lVar52 != 0; lVar52 = lVar52 + -0x48) {
                                                  dVar104 = *(double *)(uVar36 + 0x38);
                                                  lVar53 = (long)*(int *)(uVar36 + 4);
                                                  if (uVar83 != 0) {
                                                    dVar104 = dVar104 - *(double *)(uVar83 + 0x38);
                                                    lVar53 = lVar53 - *(int *)(uVar83 + 4);
                                                  }
                                                  dVar97 = dVar94;
                                                  if (dVar104 <= 0.0) {
                                                    *(undefined8 *)(uVar36 + 0x28) =
                                                         0xbff0000000000000;
                                                    if (uVar56 <= uVar36) {
                                                      uVar56 = uVar64;
                                                    }
                                                  }
                                                  else if ((uVar56 <= uVar36) ||
                                                          (0.0 < *(double *)(uVar36 + 0x28))) {
                                                    if (lVar53 == 0) {
                                                      if (uVar83 == 0) {
                                                        __assert_fail("pass0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x5f7,"void calcrdslopes(jpc_enc_cblk_t *)");
                                                  }
                                                  }
                                                  else {
                                                    dVar97 = dVar104 / (double)lVar53;
                                                    if ((uVar83 == 0) || (dVar97 < dVar94)) {
                                                      *(double *)(uVar36 + 0x28) = dVar97;
                                                      uVar83 = uVar36;
                                                      if (uVar56 <= uVar36) {
                                                        uVar56 = uVar64;
                                                      }
                                                      goto LAB_00120da3;
                                                    }
                                                  }
                                                  *(undefined8 *)(uVar83 + 0x28) = 0;
                                                  break;
                                                  }
LAB_00120da3:
                                                  uVar36 = uVar64;
                                                  dVar94 = dVar97;
                                                }
                                                goto LAB_00120d14;
                                              }
                                              for (; lVar89 != 0; lVar89 = lVar89 + -0x48) {
                                                pjVar45 = *(jpc_enc_tcmpt_t **)(uVar21 + 0x28);
                                                pjVar95 = local_17b0;
                                                if (0.0 < (double)pjVar45) {
                                                  pjVar95 = pjVar45;
                                                  if ((double)local_17a0 <= (double)pjVar45) {
                                                    pjVar95 = local_17a0;
                                                  }
                                                  local_17a0 = pjVar95;
                                                  pjVar95 = pjVar45;
                                                  if ((double)pjVar45 <= (double)local_17b0) {
                                                    pjVar95 = local_17b0;
                                                  }
                                                }
                                                uVar21 = uVar21 + 0x48;
                                                local_17b0 = pjVar95;
                                              }
                                            }
                                          }
                                          lVar85 = lVar85 + 0x60;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              if (9 < iVar17) {
                                jas_eprintf("min rdslope = %f max rdslope = %f\n",local_17a0,
                                            local_17b0);
                              }
                              jpc_init_t2state(enc,1);
                              for (uVar21 = 0; uVar21 != uVar84; uVar21 = uVar21 + 1) {
                                uVar62 = 0;
                                tcmpt = (jpc_enc_tcmpt_t *)0x0;
                                local_1760 = local_17b0;
                                local_1720 = local_17a0;
                                uVar18 = 0;
                                do {
                                  uVar56 = puVar35[uVar21];
                                  uVar63 = (uint)uVar21;
                                  if (uVar56 == 0xffffffffffffffff) {
                                    if (uVar21 != uVar25) {
                                      __assert_fail("lyrno == numlyrs - 1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x6b0,
                                                  "int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)"
                                                  );
                                    }
                                    bVar93 = false;
                                    uVar56 = 1;
                                    tcmpt = (jpc_enc_tcmpt_t *)0xbff0000000000000;
                                    goto LAB_00121221;
                                  }
                                  pjVar96 = (jpc_enc_tcmpt_t *)
                                            (((double)local_1760 + (double)local_1720) * 0.5);
                                  jpc_save_t2state(enc);
                                  lVar85 = jas_stream_tell(pjVar44);
                                  if (lVar85 < 0) {
                                    __assert_fail("oldpos >= 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x6bb,
                                                  "int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)"
                                                 );
                                  }
                                  local_1788 = pjVar34->tcmpts;
                                  pjVar45 = local_1788 + pjVar34->numtcmpts;
                                  for (cmptno_1 = (uint_fast16_t)local_1788;
                                      (jpc_enc_tcmpt_t *)cmptno_1 != pjVar45;
                                      cmptno_1 = cmptno_1 + 0x478) {
                                    lVar89 = *(long *)(cmptno_1 + 8);
                                    lVar52 = (ulong)*(uint *)cmptno_1 * 0x68 + lVar89;
                                    for (; lVar89 != lVar52; lVar89 = lVar89 + 0x68) {
                                      plVar76 = *(long **)(lVar89 + 0x58);
                                      if (plVar76 != (long *)0x0) {
                                        plVar81 = plVar76 + (ulong)*(uint *)(lVar89 + 0x50) * 8;
                                        for (; plVar76 != plVar81; plVar76 = plVar76 + 8) {
                                          if (plVar76[1] != 0) {
                                            lVar53 = *plVar76;
                                            iVar67 = *(int *)(lVar89 + 0x30);
                                            for (iVar19 = 0; iVar19 != iVar67; iVar19 = iVar19 + 1)
                                            {
                                              puVar65 = *(uint **)(lVar53 + 0x30);
                                              if (puVar65 != (uint *)0x0) {
                                                puVar87 = puVar65 + (ulong)*(uint *)(lVar53 + 0x28)
                                                                    * 0x1a;
                                                for (; puVar65 != puVar87; puVar65 = puVar65 + 0x1a)
                                                {
                                                  lVar59 = *(long *)(puVar65 + 0x12);
                                                  if (lVar59 != 0) {
                                                    lVar68 = (ulong)*puVar65 * 0x48 +
                                                             *(long *)(puVar65 + 2);
                                                    lVar75 = lVar59;
                                                    lVar90 = lVar59;
                                                    while (lVar90 != lVar68) {
                                                      pdVar3 = (double *)(lVar90 + 0x28);
                                                      lVar90 = lVar90 + 0x48;
                                                      if ((double)pjVar96 <= *pdVar3) {
                                                        lVar75 = lVar90;
                                                      }
                                                    }
                                                    for (; lVar59 != lVar75; lVar59 = lVar59 + 0x48)
                                                    {
                                                      *(uint *)(lVar59 + 0x20) = uVar63;
                                                    }
                                                    for (; lVar75 != lVar68; lVar75 = lVar75 + 0x48)
                                                    {
                                                      *(undefined4 *)(lVar75 + 0x20) = 0xffffffff;
                                                    }
                                                  }
                                                }
                                              }
                                              lVar53 = lVar53 + 0x60;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  for (; local_1788 != pjVar45; local_1788 = local_1788 + 1) {
                                    pjVar69 = local_1788->rlvls;
                                    pjVar91 = pjVar69 + local_1788->numrlvls;
                                    for (; pjVar69 != pjVar91; pjVar69 = pjVar69 + 1) {
                                      if (pjVar69->bands != (jpc_enc_band_t *)0x0) {
                                        uVar61 = 0;
                                        while (uVar61 < pjVar69->numprcs) {
                                          iVar67 = jpc_enc_encpkt(enc,pjVar44,
                                                                  (int)(((long)local_1788 -
                                                                        (long)pjVar34->tcmpts) /
                                                                       0x478),
                                                                  (int)(((long)pjVar69 -
                                                                        (long)local_1788->rlvls) /
                                                                       0x68),uVar61,uVar63);
                                          uVar61 = uVar61 + 1;
                                          if (iVar67 != 0) goto LAB_0011ee60;
                                        }
                                      }
                                    }
                                  }
                                  uVar36 = jas_stream_tell(pjVar44);
                                  if ((long)uVar36 < 0) {
                                    __assert_fail("pos >= 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x6fd,
                                                  "int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)"
                                                 );
                                  }
                                  pjVar45 = pjVar96;
                                  if (uVar36 <= uVar56) {
                                    if ((uVar62 != 0) && ((double)tcmpt <= (double)pjVar96)) {
                                      pjVar45 = tcmpt;
                                    }
                                    tcmpt = pjVar45;
                                    uVar62 = 1;
                                    local_1760 = pjVar96;
                                    pjVar45 = local_1720;
                                  }
                                  local_1720 = pjVar45;
                                  jpc_restore_t2state(enc);
                                  lVar85 = jas_stream_seek(pjVar44,lVar85,0);
                                  if (lVar85 < 0) goto LAB_0012179a;
                                  if (9 < iVar17) {
                                    jas_eprintf("maxlen=%08ld actuallen=%08ld thresh=%f\n",pjVar96,
                                                uVar56,uVar36);
                                  }
                                } while (((double)local_1720 < (double)local_1760 + -0.001) &&
                                        (bVar93 = uVar18 < 0x1f, uVar18 = uVar18 + 1, bVar93));
                                uVar56 = 0;
                                if (uVar62 == 0) {
                                  jas_eprintf("warning: empty layer generated\n");
                                  bVar93 = true;
                                }
                                else {
                                  bVar93 = false;
                                  uVar56 = (ulong)uVar62;
                                }
LAB_00121221:
                                if (9 < iVar17) {
                                  jas_eprintf("success %d goodthresh %f\n",tcmpt,uVar56);
                                }
                                cmptno_1 = (uint_fast16_t)pjVar34->tcmpts;
                                pjVar96 = (jpc_enc_tcmpt_t *)
                                          (cmptno_1 + (ulong)pjVar34->numtcmpts * 0x478);
                                for (local_1788 = (jpc_enc_tcmpt_t *)cmptno_1; local_1788 != pjVar96
                                    ; local_1788 = local_1788 + 1) {
                                  pjVar69 = local_1788->rlvls;
                                  pjVar91 = pjVar69 + local_1788->numrlvls;
                                  for (; pjVar69 != pjVar91; pjVar69 = pjVar69 + 1) {
                                    pjVar77 = pjVar69->bands;
                                    if (pjVar77 != (jpc_enc_band_t *)0x0) {
                                      pjVar42 = pjVar77 + pjVar69->numbands;
                                      for (; pjVar77 != pjVar42; pjVar77 = pjVar77 + 1) {
                                        if (pjVar77->data != (jas_matrix_t *)0x0) {
                                          pjVar38 = pjVar77->prcs;
                                          uVar62 = pjVar69->numprcs;
                                          for (uVar18 = 0; uVar18 != uVar62; uVar18 = uVar18 + 1) {
                                            pjVar70 = pjVar38->cblks;
                                            if (pjVar70 != (jpc_enc_cblk_t *)0x0) {
                                              pjVar66 = pjVar70 + pjVar38->numcblks;
                                              for (; pjVar70 != pjVar66; pjVar70 = pjVar70 + 1) {
                                                pjVar54 = pjVar70->curpass;
                                                if (pjVar54 != (jpc_enc_pass_t *)0x0) {
                                                  uVar61 = pjVar70->numpasses;
                                                  pjVar15 = pjVar70->passes;
                                                  pjVar60 = pjVar54;
                                                  pjVar92 = pjVar54;
                                                  if (!bVar93) {
                                                    while (pjVar92 != pjVar15 + uVar61) {
                                                      pjVar4 = &pjVar92->rdslope;
                                                      pjVar92 = pjVar92 + 1;
                                                      if ((double)tcmpt <= *pjVar4) {
                                                        pjVar60 = pjVar92;
                                                      }
                                                    }
                                                  }
                                                  for (; pjVar54 != pjVar60; pjVar54 = pjVar54 + 1)
                                                  {
                                                    pjVar54->lyrno = uVar63;
                                                  }
                                                  for (; pjVar60 != pjVar15 + uVar61;
                                                      pjVar60 = pjVar60 + 1) {
                                                    pjVar60->lyrno = 0xffffffff;
                                                  }
                                                }
                                              }
                                            }
                                            pjVar38 = pjVar38 + 1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                for (; (jpc_enc_tcmpt_t *)cmptno_1 != pjVar96;
                                    cmptno_1 = cmptno_1 + 0x478) {
                                  lVar85 = *(long *)(cmptno_1 + 8);
                                  lVar89 = (ulong)*(uint *)cmptno_1 * 0x68 + lVar85;
                                  for (; lVar85 != lVar89; lVar85 = lVar85 + 0x68) {
                                    if (*(long *)(lVar85 + 0x58) != 0) {
                                      uVar62 = 0;
                                      while (uVar62 < *(uint *)(lVar85 + 0x30)) {
                                        iVar67 = jpc_enc_encpkt(enc,pjVar44,
                                                                (int)((long)(cmptno_1 -
                                                                            (long)pjVar34->tcmpts) /
                                                                     0x478),
                                                                (int)((lVar85 - *(long *)(cmptno_1 +
                                                                                         8)) / 0x68)
                                                                ,uVar62,uVar63);
                                        uVar62 = uVar62 + 1;
                                        if (iVar67 != 0) goto LAB_0011ee60;
                                      }
                                    }
                                  }
                                }
                              }
                              if (4 < iVar17) {
                                pjVar34 = *ppjVar50;
                                for (uVar84 = 0; uVar84 < pjVar34->numlyrs; uVar84 = uVar84 + 1) {
                                  cmptno_1 = 0;
                                  jas_eprintf("lyrno = %02u\n",(ulong)uVar84);
                                  local_1768 = pjVar34->tcmpts;
                                  while ((uint)cmptno_1 < pjVar34->numtcmpts) {
                                    local_1780 = local_1768->rlvls;
                                    tcmpt = (jpc_enc_tcmpt_t *)0x0;
                                    while ((uint)tcmpt < local_1768->numrlvls) {
                                      pjVar77 = local_1780->bands;
                                      if (pjVar77 != (jpc_enc_band_t *)0x0) {
                                        for (uVar62 = 0; uVar62 < local_1780->numbands;
                                            uVar62 = uVar62 + 1) {
                                          if (pjVar77->data != (jas_matrix_t *)0x0) {
                                            local_1788 = (jpc_enc_tcmpt_t *)pjVar77->prcs;
                                            for (uVar18 = 0; uVar18 < local_1780->numprcs;
                                                uVar18 = uVar18 + 1) {
                                              pjVar70 = *(jpc_enc_cblk_t **)
                                                         local_1788->prcwidthexpns;
                                              if (pjVar70 != (jpc_enc_cblk_t *)0x0) {
                                                for (uVar63 = 0;
                                                    uVar63 < *(uint *)&local_1788->synweight;
                                                    uVar63 = uVar63 + 1) {
                                                  uVar61 = 0;
                                                  for (puVar65 = &pjVar70->passes->lyrno;
                                                      (uVar61 < pjVar70->numpasses &&
                                                      (*puVar65 == uVar84));
                                                      puVar65 = puVar65 + 0x12) {
                                                    in_stack_ffffffffffffe838 =
                                                         (jas_matrix_t *)
                                                         CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffe838 >> 0x20),uVar63);
                                                  jas_eprintf(
                                                  "lyrno=%02d cmptno=%02d rlvlno=%02d bandno=%02d prcno=%02d cblkno=%03d passno=%03d\n"
                                                  ,(ulong)uVar84,cmptno_1,tcmpt,(ulong)uVar62,
                                                  (ulong)uVar18,in_stack_ffffffffffffe838,uVar61);
                                                  uVar61 = uVar61 + 1;
                                                  }
                                                  pjVar70 = pjVar70 + 1;
                                                }
                                              }
                                              local_1788 = (jpc_enc_tcmpt_t *)
                                                           ((long)local_1788 + 0x60);
                                            }
                                          }
                                          pjVar77 = pjVar77 + 1;
                                        }
                                      }
                                      local_1780 = local_1780 + 1;
                                      tcmpt = (jpc_enc_tcmpt_t *)(ulong)((uint)tcmpt + 1);
                                    }
                                    local_1768 = local_1768 + 1;
                                    cmptno_1 = (uint_fast16_t)((uint)cmptno_1 + 1);
                                  }
                                }
                              }
                              jas_stream_close(pjVar44);
                              if (9 < iVar17) {
                                jas_eprintf("finished rate allocation\n");
                              }
                              if (enc->tmpstream == (jas_stream_t *)0x0) {
                                __assert_fail("enc->tmpstream",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                              ,0x5b5,"int jpc_enc_encodetiledata(jpc_enc_t *)");
                              }
                              iVar17 = jpc_enc_encpkts(enc,enc->tmpstream);
                              if (iVar17 != 0) {
                                pcVar78 = "dotile failed\n";
                                goto LAB_001216f6;
                              }
                              pjVar44 = enc->tmpstream;
                              uVar23 = jas_stream_tell(pjVar44);
                              lVar85 = jas_stream_seek(pjVar44,6,0);
                              if (lVar85 < 0) goto LAB_0011ee60;
                              jpc_putuint32(enc->tmpstream,uVar23);
                              lVar85 = jas_stream_seek(enc->tmpstream,0,0);
                              if ((lVar85 < 0) ||
                                 (iVar17 = jpc_putdata(enc->out,enc->tmpstream,-1), iVar17 != 0))
                              goto LAB_0011ee60;
                              enc->len = enc->len + uVar23;
                              jas_stream_close(enc->tmpstream);
                              enc->tmpstream = (jas_stream_t *)0x0;
                              jpc_enc_tile_destroy(enc->curtile);
                              enc->curtile = (jpc_enc_tile_t *)0x0;
                            }
                            pjVar28 = jpc_ms_create(0xffd9);
                            *ppjVar2 = pjVar28;
                            if (pjVar28 == (jpc_ms_t *)0x0) {
                              local_1778 = "cannot create EOC marker\n";
                            }
                            else {
                              iVar17 = jpc_putms(enc->out,enc->cstate,pjVar28);
                              if (iVar17 == 0) {
                                jpc_ms_destroy(enc->mrk);
                                enc->mrk = (jpc_ms_t *)0x0;
                                iVar17 = jas_stream_flush(enc->out);
                                if (iVar17 == 0) {
                                  jpc_enc_destroy(enc);
                                  return 0;
                                }
                                local_1778 = "stream flush failed\n";
                              }
                              else {
                                local_1778 = "cannot write EOC marker\n";
                              }
                            }
                          }
LAB_0011ee60:
                          jas_eprintf(local_1778);
                          jpc_enc_destroy(enc);
                          goto LAB_0011e339;
                        }
                        jpc_enc_destroy(enc);
                      }
                      jas_eprintf("jpc_enc_create failed\n");
                      jpc_enc_cp_destroy(pjVar20);
                      goto LAB_0011e339;
                    }
                    lVar85 = 0;
                    do {
                      if (uVar25 - 2 == lVar85) {
                        uVar23 = pjVar20->totalsize;
                        if (uVar23 == 0xffffffffffffffff) goto LAB_0011ed84;
                        auVar99._8_4_ = (int)(uVar23 >> 0x20);
                        auVar99._0_8_ = uVar23;
                        auVar99._12_4_ = 0x45300000;
                        lVar85 = 0;
                        goto LAB_0011ed35;
                      }
                      pjVar26 = (pjVar20->tcp).ilyrrates;
                      plVar76 = pjVar26 + lVar85;
                      lVar89 = lVar85 + 1;
                      lVar85 = lVar85 + 1;
                    } while (*plVar76 < pjVar26[lVar89]);
                    pcVar78 = "intermediate layer rates must increase monotonically\n";
                  }
                  else {
                    pcVar78 = "invalid number of guard bits\n";
                  }
LAB_0011ec7c:
                  jas_eprintf(pcVar78);
                  goto LAB_0011e311;
                }
                pcVar78 = "too many layers\n";
              }
              else {
                pcVar78 = "code block size too large\n";
              }
              goto LAB_0011e30a;
            }
            bVar47 = (byte)uVar57;
            pcVar78 = "invalid code block height %d\n";
          }
          jas_eprintf(pcVar78,(ulong)(uint)(1 << (bVar47 & 0x1f)));
          goto LAB_0011e311;
        }
        pcVar78 = "invalid precinct height\n";
      }
      else {
        pcVar78 = "invalid precinct width\n";
      }
LAB_0011e30a:
      jas_eprintf(pcVar78);
    }
  }
LAB_0011e311:
  if (bandinfos[0]._0_8_ != 0) {
    jas_free((void *)bandinfos[0]._0_8_);
  }
  jpc_enc_cp_destroy(pjVar20);
LAB_0011e32b:
  jas_eprintf("invalid JP encoder options\n");
LAB_0011e339:
  jas_eprintf("jpc_encode failed\n");
  return -1;
}

Assistant:

int jpc_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	jpc_enc_t *enc;
	jpc_enc_cp_t *cp;

	enc = 0;
	cp = 0;

	jpc_initluts();

	if (!(cp = cp_create(optstr, image))) {
		jas_eprintf("invalid JP encoder options\n");
		goto error;
	}

	if (!(enc = jpc_enc_create(cp, out, image))) {
		jas_eprintf("jpc_enc_create failed\n");
		goto error;
	}
	cp = 0;

	/* Encode the main header. */
	if (jpc_enc_encodemainhdr(enc)) {
		jas_eprintf("cannot encode main header\n");
		goto error;
	}

	/* Encode the main body.  This constitutes most of the encoding work. */
	if (jpc_enc_encodemainbody(enc)) {
		jas_eprintf("cannot encode main body\n");
		goto error;
	}

	/* Write EOC marker segment. */
	if (!(enc->mrk = jpc_ms_create(JPC_MS_EOC))) {
		jas_eprintf("cannot create EOC marker\n");
		goto error;
	}
	if (jpc_putms(enc->out, enc->cstate, enc->mrk)) {
		jas_eprintf("cannot write EOC marker\n");
		goto error;
	}
	jpc_ms_destroy(enc->mrk);
	enc->mrk = 0;

	if (jas_stream_flush(enc->out)) {
		jas_eprintf("stream flush failed\n");
		goto error;
	}

	jpc_enc_destroy(enc);

	return 0;

error:
	if (cp) {
		jpc_enc_cp_destroy(cp);
	}
	if (enc) {
		jpc_enc_destroy(enc);
	}
	jas_eprintf("jpc_encode failed\n");
	return -1;
}